

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  byte bVar65;
  byte bVar66;
  byte bVar67;
  ulong uVar68;
  byte bVar69;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ulong uVar70;
  undefined8 in_R10;
  long lVar71;
  bool bVar72;
  undefined1 uVar73;
  undefined1 uVar74;
  uint uVar75;
  uint uVar128;
  uint uVar129;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  uint uVar130;
  uint uVar134;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar87 [16];
  undefined1 auVar127 [32];
  float pp;
  float fVar135;
  undefined4 uVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar143 [16];
  undefined1 auVar148 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar149;
  float fVar159;
  float fVar160;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [28];
  undefined1 auVar227 [64];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_914;
  ulong local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_790 [16];
  RTCFilterFunctionNArguments local_780;
  int local_74c;
  uint local_748;
  uint local_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined8 local_6e0;
  float local_6d8;
  float local_6d4;
  undefined4 local_6d0;
  uint local_6cc;
  uint local_6c8;
  uint local_6c4;
  uint local_6c0;
  Primitive *local_6b0;
  ulong local_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar119 [32];
  
  uVar70 = (ulong)(byte)prim[1];
  fVar149 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar85 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  fVar165 = fVar149 * auVar85._0_4_;
  fVar135 = fVar149 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar78);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar79);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar94 = vpmovsxbd_avx2(auVar81);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar95 = vpmovsxbd_avx2(auVar80);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar70 * 0xc + 6);
  auVar96 = vpmovsxbd_avx2(auVar76);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar92 = vpmovsxbd_avx2(auVar82);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar97 = vpmovsxbd_avx2(auVar77);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 * 0x13 + 6);
  auVar98 = vpmovsxbd_avx2(auVar83);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar70 * 0x14 + 6);
  auVar100 = vpmovsxbd_avx2(auVar86);
  auVar99 = vcvtdq2ps_avx(auVar100);
  auVar109._4_4_ = fVar135;
  auVar109._0_4_ = fVar135;
  auVar109._8_4_ = fVar135;
  auVar109._12_4_ = fVar135;
  auVar109._16_4_ = fVar135;
  auVar109._20_4_ = fVar135;
  auVar109._24_4_ = fVar135;
  auVar109._28_4_ = fVar135;
  auVar205._8_4_ = 1;
  auVar205._0_8_ = 0x100000001;
  auVar205._12_4_ = 1;
  auVar205._16_4_ = 1;
  auVar205._20_4_ = 1;
  auVar205._24_4_ = 1;
  auVar205._28_4_ = 1;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar90 = ZEXT1632(CONCAT412(fVar149 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar149 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar149 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar135))));
  auVar101 = vpermps_avx2(auVar205,auVar90);
  auVar89 = vpermps_avx512vl(auVar88,auVar90);
  fVar135 = auVar89._0_4_;
  auVar206._0_4_ = fVar135 * auVar94._0_4_;
  fVar159 = auVar89._4_4_;
  auVar206._4_4_ = fVar159 * auVar94._4_4_;
  fVar160 = auVar89._8_4_;
  auVar206._8_4_ = fVar160 * auVar94._8_4_;
  fVar162 = auVar89._12_4_;
  auVar206._12_4_ = fVar162 * auVar94._12_4_;
  fVar161 = auVar89._16_4_;
  auVar206._16_4_ = fVar161 * auVar94._16_4_;
  fVar163 = auVar89._20_4_;
  auVar206._20_4_ = fVar163 * auVar94._20_4_;
  fVar164 = auVar89._24_4_;
  auVar206._28_36_ = in_ZMM4._28_36_;
  auVar206._24_4_ = fVar164 * auVar94._24_4_;
  auVar90._4_4_ = auVar92._4_4_ * fVar159;
  auVar90._0_4_ = auVar92._0_4_ * fVar135;
  auVar90._8_4_ = auVar92._8_4_ * fVar160;
  auVar90._12_4_ = auVar92._12_4_ * fVar162;
  auVar90._16_4_ = auVar92._16_4_ * fVar161;
  auVar90._20_4_ = auVar92._20_4_ * fVar163;
  auVar90._24_4_ = auVar92._24_4_ * fVar164;
  auVar90._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar99._4_4_ * fVar159;
  auVar100._0_4_ = auVar99._0_4_ * fVar135;
  auVar100._8_4_ = auVar99._8_4_ * fVar160;
  auVar100._12_4_ = auVar99._12_4_ * fVar162;
  auVar100._16_4_ = auVar99._16_4_ * fVar161;
  auVar100._20_4_ = auVar99._20_4_ * fVar163;
  auVar100._24_4_ = auVar99._24_4_ * fVar164;
  auVar100._28_4_ = auVar89._28_4_;
  auVar78 = vfmadd231ps_fma(auVar206._0_32_,auVar101,auVar91);
  auVar79 = vfmadd231ps_fma(auVar90,auVar101,auVar96);
  auVar81 = vfmadd231ps_fma(auVar100,auVar98,auVar101);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar109,auVar93);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar109,auVar95);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar97,auVar109);
  auVar110._4_4_ = fVar165;
  auVar110._0_4_ = fVar165;
  auVar110._8_4_ = fVar165;
  auVar110._12_4_ = fVar165;
  auVar110._16_4_ = fVar165;
  auVar110._20_4_ = fVar165;
  auVar110._24_4_ = fVar165;
  auVar110._28_4_ = fVar165;
  auVar101 = ZEXT1632(CONCAT412(fVar149 * auVar85._12_4_,
                                CONCAT48(fVar149 * auVar85._8_4_,
                                         CONCAT44(fVar149 * auVar85._4_4_,fVar165))));
  auVar100 = vpermps_avx2(auVar205,auVar101);
  auVar90 = vpermps_avx512vl(auVar88,auVar101);
  fVar149 = auVar90._0_4_;
  fVar135 = auVar90._4_4_;
  auVar101._4_4_ = fVar135 * auVar94._4_4_;
  auVar101._0_4_ = fVar149 * auVar94._0_4_;
  fVar159 = auVar90._8_4_;
  auVar101._8_4_ = fVar159 * auVar94._8_4_;
  fVar160 = auVar90._12_4_;
  auVar101._12_4_ = fVar160 * auVar94._12_4_;
  fVar162 = auVar90._16_4_;
  auVar101._16_4_ = fVar162 * auVar94._16_4_;
  fVar161 = auVar90._20_4_;
  auVar101._20_4_ = fVar161 * auVar94._20_4_;
  fVar163 = auVar90._24_4_;
  auVar101._24_4_ = fVar163 * auVar94._24_4_;
  auVar101._28_4_ = 1;
  auVar88._4_4_ = auVar92._4_4_ * fVar135;
  auVar88._0_4_ = auVar92._0_4_ * fVar149;
  auVar88._8_4_ = auVar92._8_4_ * fVar159;
  auVar88._12_4_ = auVar92._12_4_ * fVar160;
  auVar88._16_4_ = auVar92._16_4_ * fVar162;
  auVar88._20_4_ = auVar92._20_4_ * fVar161;
  auVar88._24_4_ = auVar92._24_4_ * fVar163;
  auVar88._28_4_ = auVar94._28_4_;
  auVar92._4_4_ = auVar99._4_4_ * fVar135;
  auVar92._0_4_ = auVar99._0_4_ * fVar149;
  auVar92._8_4_ = auVar99._8_4_ * fVar159;
  auVar92._12_4_ = auVar99._12_4_ * fVar160;
  auVar92._16_4_ = auVar99._16_4_ * fVar162;
  auVar92._20_4_ = auVar99._20_4_ * fVar161;
  auVar92._24_4_ = auVar99._24_4_ * fVar163;
  auVar92._28_4_ = auVar90._28_4_;
  auVar80 = vfmadd231ps_fma(auVar101,auVar100,auVar91);
  auVar76 = vfmadd231ps_fma(auVar88,auVar100,auVar96);
  auVar82 = vfmadd231ps_fma(auVar92,auVar100,auVar98);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar110,auVar93);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar110,auVar95);
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar110,auVar97);
  auVar93 = vandps_avx(ZEXT1632(auVar78),auVar106);
  auVar108._8_4_ = 0x219392ef;
  auVar108._0_8_ = 0x219392ef219392ef;
  auVar108._12_4_ = 0x219392ef;
  auVar108._16_4_ = 0x219392ef;
  auVar108._20_4_ = 0x219392ef;
  auVar108._24_4_ = 0x219392ef;
  auVar108._28_4_ = 0x219392ef;
  uVar68 = vcmpps_avx512vl(auVar93,auVar108,1);
  bVar72 = (bool)((byte)uVar68 & 1);
  auVar89._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar78._0_4_;
  bVar72 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar78._4_4_;
  bVar72 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar78._8_4_;
  bVar72 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar78._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar79),auVar106);
  uVar68 = vcmpps_avx512vl(auVar93,auVar108,1);
  bVar72 = (bool)((byte)uVar68 & 1);
  auVar102._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._0_4_;
  bVar72 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._4_4_;
  bVar72 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._8_4_;
  bVar72 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar81),auVar106);
  uVar68 = vcmpps_avx512vl(auVar93,auVar108,1);
  bVar72 = (bool)((byte)uVar68 & 1);
  auVar93._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar81._0_4_;
  bVar72 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar81._4_4_;
  bVar72 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar81._8_4_;
  bVar72 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar81._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar107._8_4_ = 0x3f800000;
  auVar107._0_8_ = 0x3f8000003f800000;
  auVar107._12_4_ = 0x3f800000;
  auVar107._16_4_ = 0x3f800000;
  auVar107._20_4_ = 0x3f800000;
  auVar107._24_4_ = 0x3f800000;
  auVar107._28_4_ = 0x3f800000;
  auVar78 = vfnmadd213ps_fma(auVar89,auVar91,auVar107);
  auVar78 = vfmadd132ps_fma(ZEXT1632(auVar78),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar102);
  auVar79 = vfnmadd213ps_fma(auVar102,auVar91,auVar107);
  auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar93);
  auVar81 = vfnmadd213ps_fma(auVar93,auVar91,auVar107);
  auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar91,auVar91);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar80));
  auVar97._4_4_ = auVar78._4_4_ * auVar93._4_4_;
  auVar97._0_4_ = auVar78._0_4_ * auVar93._0_4_;
  auVar97._8_4_ = auVar78._8_4_ * auVar93._8_4_;
  auVar97._12_4_ = auVar78._12_4_ * auVar93._12_4_;
  auVar97._16_4_ = auVar93._16_4_ * 0.0;
  auVar97._20_4_ = auVar93._20_4_ * 0.0;
  auVar97._24_4_ = auVar93._24_4_ * 0.0;
  auVar97._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar80));
  auVar105._0_4_ = auVar78._0_4_ * auVar93._0_4_;
  auVar105._4_4_ = auVar78._4_4_ * auVar93._4_4_;
  auVar105._8_4_ = auVar78._8_4_ * auVar93._8_4_;
  auVar105._12_4_ = auVar78._12_4_ * auVar93._12_4_;
  auVar105._16_4_ = auVar93._16_4_ * 0.0;
  auVar105._20_4_ = auVar93._20_4_ * 0.0;
  auVar105._24_4_ = auVar93._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0xe + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar76));
  auVar98._4_4_ = auVar79._4_4_ * auVar93._4_4_;
  auVar98._0_4_ = auVar79._0_4_ * auVar93._0_4_;
  auVar98._8_4_ = auVar79._8_4_ * auVar93._8_4_;
  auVar98._12_4_ = auVar79._12_4_ * auVar93._12_4_;
  auVar98._16_4_ = auVar93._16_4_ * 0.0;
  auVar98._20_4_ = auVar93._20_4_ * 0.0;
  auVar98._24_4_ = auVar93._24_4_ * 0.0;
  auVar98._28_4_ = auVar93._28_4_;
  auVar92 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar76));
  auVar104._0_4_ = auVar79._0_4_ * auVar93._0_4_;
  auVar104._4_4_ = auVar79._4_4_ * auVar93._4_4_;
  auVar104._8_4_ = auVar79._8_4_ * auVar93._8_4_;
  auVar104._12_4_ = auVar79._12_4_ * auVar93._12_4_;
  auVar104._16_4_ = auVar93._16_4_ * 0.0;
  auVar104._20_4_ = auVar93._20_4_ * 0.0;
  auVar104._24_4_ = auVar93._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x15 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar82));
  auVar99._4_4_ = auVar93._4_4_ * auVar81._4_4_;
  auVar99._0_4_ = auVar93._0_4_ * auVar81._0_4_;
  auVar99._8_4_ = auVar93._8_4_ * auVar81._8_4_;
  auVar99._12_4_ = auVar93._12_4_ * auVar81._12_4_;
  auVar99._16_4_ = auVar93._16_4_ * 0.0;
  auVar99._20_4_ = auVar93._20_4_ * 0.0;
  auVar99._24_4_ = auVar93._24_4_ * 0.0;
  auVar99._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar82));
  auVar103._0_4_ = auVar81._0_4_ * auVar93._0_4_;
  auVar103._4_4_ = auVar81._4_4_ * auVar93._4_4_;
  auVar103._8_4_ = auVar81._8_4_ * auVar93._8_4_;
  auVar103._12_4_ = auVar81._12_4_ * auVar93._12_4_;
  auVar103._16_4_ = auVar93._16_4_ * 0.0;
  auVar103._20_4_ = auVar93._20_4_ * 0.0;
  auVar103._24_4_ = auVar93._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar97,auVar105);
  auVar91 = vpminsd_avx2(auVar98,auVar104);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91 = vpminsd_avx2(auVar99,auVar103);
  uVar136 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar94._4_4_ = uVar136;
  auVar94._0_4_ = uVar136;
  auVar94._8_4_ = uVar136;
  auVar94._12_4_ = uVar136;
  auVar94._16_4_ = uVar136;
  auVar94._20_4_ = uVar136;
  auVar94._24_4_ = uVar136;
  auVar94._28_4_ = uVar136;
  auVar91 = vmaxps_avx512vl(auVar91,auVar94);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_200 = vmulps_avx512vl(auVar93,auVar91);
  auVar93 = vpmaxsd_avx2(auVar97,auVar105);
  auVar91 = vpmaxsd_avx2(auVar98,auVar104);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar91 = vpmaxsd_avx2(auVar99,auVar103);
  fVar149 = (ray->super_RayK<1>).tfar;
  auVar95._4_4_ = fVar149;
  auVar95._0_4_ = fVar149;
  auVar95._8_4_ = fVar149;
  auVar95._12_4_ = fVar149;
  auVar95._16_4_ = fVar149;
  auVar95._20_4_ = fVar149;
  auVar95._24_4_ = fVar149;
  auVar95._28_4_ = fVar149;
  auVar91 = vminps_avx512vl(auVar91,auVar95);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar96);
  uVar17 = vcmpps_avx512vl(local_200,auVar93,2);
  uVar20 = vpcmpgtd_avx512vl(auVar92,_DAT_01fb4ba0);
  local_6a8 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar17 & (byte)uVar20));
  local_6b0 = prim;
LAB_01a6db5d:
  local_74c = 1;
  if (local_6a8 == 0) {
    return;
  }
  lVar71 = 0;
  for (uVar68 = local_6a8; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar71 = lVar71 + 1;
  }
  local_910 = (ulong)*(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_908 = (ulong)*(uint *)(prim + lVar71 * 4 + 6);
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar71 * 4 + 6));
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar71 = *(long *)&pGVar7[1].time_range.upper;
  auVar78 = *(undefined1 (*) [16])(lVar71 + (long)p_Var8 * uVar68);
  auVar79 = *(undefined1 (*) [16])(lVar71 + (uVar68 + 1) * (long)p_Var8);
  auVar81 = *(undefined1 (*) [16])(lVar71 + (uVar68 + 2) * (long)p_Var8);
  local_6a8 = local_6a8 - 1 & local_6a8;
  auVar80 = *(undefined1 (*) [16])(lVar71 + (uVar68 + 3) * (long)p_Var8);
  if (local_6a8 != 0) {
    uVar70 = local_6a8 - 1 & local_6a8;
    for (uVar68 = local_6a8; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    }
    if (uVar70 != 0) {
      for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar84._0_4_ = auVar78._0_4_ + auVar79._0_4_ + auVar81._0_4_ + auVar80._0_4_;
  auVar84._4_4_ = auVar78._4_4_ + auVar79._4_4_ + auVar81._4_4_ + auVar80._4_4_;
  auVar84._8_4_ = auVar78._8_4_ + auVar79._8_4_ + auVar81._8_4_ + auVar80._8_4_;
  auVar84._12_4_ = auVar78._12_4_ + auVar79._12_4_ + auVar81._12_4_ + auVar80._12_4_;
  aVar5 = (ray->super_RayK<1>).org.field_0;
  aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar85._8_4_ = 0x3e800000;
  auVar85._0_8_ = 0x3e8000003e800000;
  auVar85._12_4_ = 0x3e800000;
  auVar76 = vmulps_avx512vl(auVar84,auVar85);
  auVar76 = vsubps_avx(auVar76,(undefined1  [16])aVar5);
  auVar76 = vdpps_avx(auVar76,(undefined1  [16])aVar6,0x7f);
  auVar82 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
  auVar225._4_12_ = ZEXT812(0) << 0x20;
  auVar225._0_4_ = auVar82._0_4_;
  auVar77 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar225);
  auVar82 = vfnmadd213ss_fma(auVar77,auVar82,ZEXT416(0x40000000));
  fVar149 = auVar76._0_4_ * auVar77._0_4_ * auVar82._0_4_;
  local_590 = ZEXT416((uint)fVar149);
  auVar87._4_4_ = fVar149;
  auVar87._0_4_ = fVar149;
  auVar87._8_4_ = fVar149;
  auVar87._12_4_ = fVar149;
  fStack_370 = fVar149;
  _local_380 = auVar87;
  fStack_36c = fVar149;
  fStack_368 = fVar149;
  fStack_364 = fVar149;
  auVar76 = vfmadd231ps_fma((undefined1  [16])aVar5,(undefined1  [16])aVar6,auVar87);
  auVar76 = vblendps_avx(auVar76,ZEXT816(0) << 0x40,8);
  auVar78 = vsubps_avx(auVar78,auVar76);
  auVar81 = vsubps_avx(auVar81,auVar76);
  local_320 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[0]));
  local_340 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
  local_3c0 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  auVar79 = vsubps_avx(auVar79,auVar76);
  auVar80 = vsubps_avx(auVar80,auVar76);
  uVar136 = auVar78._0_4_;
  local_660._4_4_ = uVar136;
  local_660._0_4_ = uVar136;
  local_660._8_4_ = uVar136;
  local_660._12_4_ = uVar136;
  local_660._16_4_ = uVar136;
  local_660._20_4_ = uVar136;
  local_660._24_4_ = uVar136;
  local_660._28_4_ = uVar136;
  auVar227 = ZEXT3264(local_660);
  auVar111._8_4_ = 1;
  auVar111._0_8_ = 0x100000001;
  auVar111._12_4_ = 1;
  auVar111._16_4_ = 1;
  auVar111._20_4_ = 1;
  auVar111._24_4_ = 1;
  auVar111._28_4_ = 1;
  local_460 = ZEXT1632(auVar78);
  local_680 = vpermps_avx2(auVar111,local_460);
  auVar229 = ZEXT3264(local_680);
  auVar113._8_4_ = 2;
  auVar113._0_8_ = 0x200000002;
  auVar113._12_4_ = 2;
  auVar113._16_4_ = 2;
  auVar113._20_4_ = 2;
  auVar113._24_4_ = 2;
  auVar113._28_4_ = 2;
  local_6a0 = vpermps_avx2(auVar113,local_460);
  auVar233 = ZEXT3264(local_6a0);
  auVar116._8_4_ = 3;
  auVar116._0_8_ = 0x300000003;
  auVar116._12_4_ = 3;
  auVar116._16_4_ = 3;
  auVar116._20_4_ = 3;
  auVar116._24_4_ = 3;
  auVar116._28_4_ = 3;
  local_620 = vpermps_avx2(auVar116,local_460);
  uVar136 = auVar79._0_4_;
  local_520._4_4_ = uVar136;
  local_520._0_4_ = uVar136;
  local_520._8_4_ = uVar136;
  local_520._12_4_ = uVar136;
  local_520._16_4_ = uVar136;
  local_520._20_4_ = uVar136;
  local_520._24_4_ = uVar136;
  local_520._28_4_ = uVar136;
  local_4a0 = ZEXT1632(auVar79);
  local_500 = vpermps_avx2(auVar111,local_4a0);
  local_7c0 = vpermps_avx512vl(auVar113,local_4a0);
  auVar246 = ZEXT3264(local_7c0);
  local_7e0 = vpermps_avx2(auVar116,local_4a0);
  auVar236 = ZEXT3264(local_7e0);
  auVar224 = ZEXT3264(local_620);
  auVar218 = ZEXT3264(local_500);
  local_800 = vbroadcastss_avx512vl(auVar81);
  auVar237 = ZEXT3264(local_800);
  local_480 = ZEXT1632(auVar81);
  local_820 = vpermps_avx512vl(auVar111,local_480);
  auVar238 = ZEXT3264(local_820);
  local_840 = vpermps_avx512vl(auVar113,local_480);
  auVar239 = ZEXT3264(local_840);
  local_860 = vpermps_avx512vl(auVar116,local_480);
  auVar240 = ZEXT3264(local_860);
  local_880 = vbroadcastss_avx512vl(auVar80);
  auVar241 = ZEXT3264(local_880);
  _local_4c0 = ZEXT1632(auVar80);
  local_8a0 = vpermps_avx512vl(auVar111,_local_4c0);
  auVar242 = ZEXT3264(local_8a0);
  local_8c0 = vpermps_avx512vl(auVar113,_local_4c0);
  auVar243 = ZEXT3264(local_8c0);
  local_8e0 = vpermps_avx512vl(auVar116,_local_4c0);
  auVar245 = ZEXT3264(local_8e0);
  auVar206 = ZEXT3264(local_520);
  auVar93 = vpermps_avx512vl(auVar113,ZEXT1632(CONCAT412(aVar6.field_3.w * aVar6.field_3.w,
                                                         CONCAT48(aVar6.z * aVar6.z,
                                                                  CONCAT44(aVar6.y * aVar6.y,
                                                                           aVar6.x * aVar6.x)))));
  auVar93 = vfmadd231ps_avx512vl(auVar93,local_340,local_340);
  local_1e0 = vfmadd231ps_avx512vl(auVar93,local_320,local_320);
  auVar244 = ZEXT3264(local_1e0);
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar112);
  uVar68 = 0;
  local_2d0 = ZEXT816(0x3f80000000000000);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar247 = ZEXT3264(auVar93);
  local_740 = local_1e0;
  do {
    auVar78 = vmovshdup_avx(local_2d0);
    auVar78 = vsubps_avx(auVar78,local_2d0);
    fVar149 = auVar78._0_4_;
    fVar162 = fVar149 * 0.04761905;
    local_900._0_4_ = local_2d0._0_4_;
    local_900._4_4_ = local_900._0_4_;
    fStack_8f8 = (float)local_900._0_4_;
    fStack_8f4 = (float)local_900._0_4_;
    register0x000012d0 = local_900._0_4_;
    register0x000012d4 = local_900._0_4_;
    register0x000012d8 = local_900._0_4_;
    register0x000012dc = local_900._0_4_;
    auVar207._4_4_ = fVar149;
    auVar207._0_4_ = fVar149;
    auVar207._8_4_ = fVar149;
    auVar207._12_4_ = fVar149;
    local_720._16_4_ = fVar149;
    local_720._0_16_ = auVar207;
    local_720._20_4_ = fVar149;
    local_720._24_4_ = fVar149;
    local_720._28_4_ = fVar149;
    auVar78 = vfmadd231ps_fma(_local_900,local_720,_DAT_01f7b040);
    auVar112 = auVar247._0_32_;
    auVar93 = vsubps_avx512vl(auVar112,ZEXT1632(auVar78));
    fVar149 = auVar78._0_4_;
    fVar135 = auVar78._4_4_;
    auVar64._4_4_ = auVar206._4_4_ * fVar135;
    auVar64._0_4_ = auVar206._0_4_ * fVar149;
    fVar159 = auVar78._8_4_;
    auVar64._8_4_ = auVar206._8_4_ * fVar159;
    fVar160 = auVar78._12_4_;
    auVar64._12_4_ = auVar206._12_4_ * fVar160;
    auVar64._16_4_ = auVar206._16_4_ * 0.0;
    auVar64._20_4_ = auVar206._20_4_ * 0.0;
    auVar64._24_4_ = auVar206._24_4_ * 0.0;
    auVar64._28_4_ = DAT_01f7b040._28_4_;
    auVar43._4_4_ = auVar218._4_4_ * fVar135;
    auVar43._0_4_ = auVar218._0_4_ * fVar149;
    auVar43._8_4_ = auVar218._8_4_ * fVar159;
    auVar43._12_4_ = auVar218._12_4_ * fVar160;
    auVar43._16_4_ = auVar218._16_4_ * 0.0;
    auVar43._20_4_ = auVar218._20_4_ * 0.0;
    auVar43._24_4_ = auVar218._24_4_ * 0.0;
    auVar43._28_4_ = local_900._0_4_;
    auVar91 = vmulps_avx512vl(auVar246._0_32_,ZEXT1632(auVar78));
    auVar219._0_4_ = auVar236._0_4_ * fVar149;
    auVar219._4_4_ = auVar236._4_4_ * fVar135;
    auVar219._8_4_ = auVar236._8_4_ * fVar159;
    auVar219._12_4_ = auVar236._12_4_ * fVar160;
    auVar219._16_4_ = auVar236._16_4_ * 0.0;
    auVar219._20_4_ = auVar236._20_4_ * 0.0;
    auVar219._28_36_ = auVar218._28_36_;
    auVar219._24_4_ = auVar236._24_4_ * 0.0;
    auVar79 = vfmadd231ps_fma(auVar64,auVar93,auVar227._0_32_);
    auVar81 = vfmadd231ps_fma(auVar43,auVar93,auVar229._0_32_);
    auVar80 = vfmadd231ps_fma(auVar91,auVar93,auVar233._0_32_);
    auVar76 = vfmadd231ps_fma(auVar219._0_32_,auVar93,auVar224._0_32_);
    auVar91 = vmulps_avx512vl(auVar237._0_32_,ZEXT1632(auVar78));
    auVar97 = ZEXT1632(auVar78);
    auVar94 = vmulps_avx512vl(auVar238._0_32_,auVar97);
    auVar95 = vmulps_avx512vl(auVar239._0_32_,auVar97);
    auVar96 = vmulps_avx512vl(auVar240._0_32_,auVar97);
    auVar82 = vfmadd231ps_fma(auVar91,auVar93,auVar206._0_32_);
    auVar77 = vfmadd231ps_fma(auVar94,auVar93,auVar218._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar246._0_32_);
    auVar83 = vfmadd231ps_fma(auVar96,auVar93,auVar236._0_32_);
    auVar94 = vmulps_avx512vl(auVar241._0_32_,auVar97);
    auVar95 = vmulps_avx512vl(auVar242._0_32_,auVar97);
    auVar96 = vmulps_avx512vl(auVar243._0_32_,auVar97);
    auVar92 = vmulps_avx512vl(auVar245._0_32_,auVar97);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar237._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar238._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar239._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar93,auVar240._0_32_);
    auVar218._28_36_ = auVar236._28_36_;
    auVar218._0_28_ =
         ZEXT1628(CONCAT412(fVar160 * auVar82._12_4_,
                            CONCAT48(fVar159 * auVar82._8_4_,
                                     CONCAT44(fVar135 * auVar82._4_4_,fVar149 * auVar82._0_4_))));
    auVar97 = vmulps_avx512vl(auVar97,ZEXT1632(auVar77));
    auVar98 = vmulps_avx512vl(ZEXT1632(auVar78),auVar91);
    auVar99 = vmulps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar83));
    auVar78 = vfmadd231ps_fma(auVar218._0_32_,auVar93,ZEXT1632(auVar79));
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,ZEXT1632(auVar81));
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,ZEXT1632(auVar80));
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar76));
    auVar216._0_4_ = auVar94._0_4_ * fVar149;
    auVar216._4_4_ = auVar94._4_4_ * fVar135;
    auVar216._8_4_ = auVar94._8_4_ * fVar159;
    auVar216._12_4_ = auVar94._12_4_ * fVar160;
    auVar216._16_4_ = auVar94._16_4_ * 0.0;
    auVar216._20_4_ = auVar94._20_4_ * 0.0;
    auVar216._24_4_ = auVar94._24_4_ * 0.0;
    auVar216._28_4_ = 0;
    auVar44._4_4_ = auVar95._4_4_ * fVar135;
    auVar44._0_4_ = auVar95._0_4_ * fVar149;
    auVar44._8_4_ = auVar95._8_4_ * fVar159;
    auVar44._12_4_ = auVar95._12_4_ * fVar160;
    auVar44._16_4_ = auVar95._16_4_ * 0.0;
    auVar44._20_4_ = auVar95._20_4_ * 0.0;
    auVar44._24_4_ = auVar95._24_4_ * 0.0;
    auVar44._28_4_ = auVar94._28_4_;
    auVar45._4_4_ = auVar96._4_4_ * fVar135;
    auVar45._0_4_ = auVar96._0_4_ * fVar149;
    auVar45._8_4_ = auVar96._8_4_ * fVar159;
    auVar45._12_4_ = auVar96._12_4_ * fVar160;
    auVar45._16_4_ = auVar96._16_4_ * 0.0;
    auVar45._20_4_ = auVar96._20_4_ * 0.0;
    auVar45._24_4_ = auVar96._24_4_ * 0.0;
    auVar45._28_4_ = auVar95._28_4_;
    auVar46._4_4_ = auVar92._4_4_ * fVar135;
    auVar46._0_4_ = auVar92._0_4_ * fVar149;
    auVar46._8_4_ = auVar92._8_4_ * fVar159;
    auVar46._12_4_ = auVar92._12_4_ * fVar160;
    auVar46._16_4_ = auVar92._16_4_ * 0.0;
    auVar46._20_4_ = auVar92._20_4_ * 0.0;
    auVar46._24_4_ = auVar92._24_4_ * 0.0;
    auVar46._28_4_ = auVar96._28_4_;
    auVar79 = vfmadd231ps_fma(auVar216,auVar93,ZEXT1632(auVar82));
    auVar81 = vfmadd231ps_fma(auVar44,auVar93,ZEXT1632(auVar77));
    auVar80 = vfmadd231ps_fma(auVar45,auVar93,auVar91);
    auVar76 = vfmadd231ps_fma(auVar46,auVar93,ZEXT1632(auVar83));
    auVar82 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar79._12_4_,
                                                 CONCAT48(fVar159 * auVar79._8_4_,
                                                          CONCAT44(fVar135 * auVar79._4_4_,
                                                                   fVar149 * auVar79._0_4_)))),
                              auVar93,ZEXT1632(auVar78));
    auVar100 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar160,
                                             CONCAT48(auVar81._8_4_ * fVar159,
                                                      CONCAT44(auVar81._4_4_ * fVar135,
                                                               auVar81._0_4_ * fVar149)))),auVar93,
                          auVar97);
    auVar101 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar80._12_4_ * fVar160,
                                             CONCAT48(auVar80._8_4_ * fVar159,
                                                      CONCAT44(auVar80._4_4_ * fVar135,
                                                               auVar80._0_4_ * fVar149)))),auVar93,
                          auVar98);
    auVar94 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar76._12_4_ * fVar160,
                                            CONCAT48(auVar76._8_4_ * fVar159,
                                                     CONCAT44(auVar76._4_4_ * fVar135,
                                                              auVar76._0_4_ * fVar149)))),auVar99,
                         auVar93);
    auVar93 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar78));
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar81),auVar97);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar80),auVar98);
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar76),auVar99);
    auVar230._0_4_ = fVar162 * auVar93._0_4_ * 3.0;
    auVar230._4_4_ = fVar162 * auVar93._4_4_ * 3.0;
    auVar230._8_4_ = fVar162 * auVar93._8_4_ * 3.0;
    auVar230._12_4_ = fVar162 * auVar93._12_4_ * 3.0;
    auVar230._16_4_ = fVar162 * auVar93._16_4_ * 3.0;
    auVar230._20_4_ = fVar162 * auVar93._20_4_ * 3.0;
    auVar230._24_4_ = fVar162 * auVar93._24_4_ * 3.0;
    auVar230._28_4_ = 0;
    auVar234._0_4_ = fVar162 * auVar91._0_4_ * 3.0;
    auVar234._4_4_ = fVar162 * auVar91._4_4_ * 3.0;
    auVar234._8_4_ = fVar162 * auVar91._8_4_ * 3.0;
    auVar234._12_4_ = fVar162 * auVar91._12_4_ * 3.0;
    auVar234._16_4_ = fVar162 * auVar91._16_4_ * 3.0;
    auVar234._20_4_ = fVar162 * auVar91._20_4_ * 3.0;
    auVar234._24_4_ = fVar162 * auVar91._24_4_ * 3.0;
    auVar234._28_4_ = 0;
    auVar235._0_4_ = fVar162 * auVar95._0_4_ * 3.0;
    auVar235._4_4_ = fVar162 * auVar95._4_4_ * 3.0;
    auVar235._8_4_ = fVar162 * auVar95._8_4_ * 3.0;
    auVar235._12_4_ = fVar162 * auVar95._12_4_ * 3.0;
    auVar235._16_4_ = fVar162 * auVar95._16_4_ * 3.0;
    auVar235._20_4_ = fVar162 * auVar95._20_4_ * 3.0;
    auVar235._24_4_ = fVar162 * auVar95._24_4_ * 3.0;
    auVar235._28_4_ = 0;
    fVar149 = auVar96._0_4_ * 3.0 * fVar162;
    fVar135 = auVar96._4_4_ * 3.0 * fVar162;
    auVar47._4_4_ = fVar135;
    auVar47._0_4_ = fVar149;
    fVar159 = auVar96._8_4_ * 3.0 * fVar162;
    auVar47._8_4_ = fVar159;
    fVar160 = auVar96._12_4_ * 3.0 * fVar162;
    auVar47._12_4_ = fVar160;
    fVar161 = auVar96._16_4_ * 3.0 * fVar162;
    auVar47._16_4_ = fVar161;
    fVar163 = auVar96._20_4_ * 3.0 * fVar162;
    auVar47._20_4_ = fVar163;
    fVar164 = auVar96._24_4_ * 3.0 * fVar162;
    auVar47._24_4_ = fVar164;
    auVar47._28_4_ = fVar162;
    auVar78 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar78);
    auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar82),_DAT_01fb9fc0,ZEXT1632(auVar78));
    auVar98 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,ZEXT1632(auVar78));
    auVar95 = ZEXT1632(auVar78);
    auVar99 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,auVar95);
    auVar212._0_4_ = auVar94._0_4_ + fVar149;
    auVar212._4_4_ = auVar94._4_4_ + fVar135;
    auVar212._8_4_ = auVar94._8_4_ + fVar159;
    auVar212._12_4_ = auVar94._12_4_ + fVar160;
    auVar212._16_4_ = auVar94._16_4_ + fVar161;
    auVar212._20_4_ = auVar94._20_4_ + fVar163;
    auVar212._24_4_ = auVar94._24_4_ + fVar164;
    auVar212._28_4_ = auVar94._28_4_ + fVar162;
    auVar93 = vmaxps_avx(auVar94,auVar212);
    auVar91 = vminps_avx(auVar94,auVar212);
    auVar90 = vpermt2ps_avx512vl(auVar94,_DAT_01fb9fc0,auVar95);
    auVar88 = vpermt2ps_avx512vl(auVar230,_DAT_01fb9fc0,auVar95);
    auVar89 = vpermt2ps_avx512vl(auVar234,_DAT_01fb9fc0,auVar95);
    auVar111 = ZEXT1632(auVar78);
    auVar102 = vpermt2ps_avx512vl(auVar235,_DAT_01fb9fc0,auVar111);
    auVar94 = vpermt2ps_avx512vl(auVar47,_DAT_01fb9fc0,auVar111);
    auVar94 = vsubps_avx(auVar90,auVar94);
    auVar95 = vsubps_avx(auVar97,ZEXT1632(auVar82));
    auVar96 = vsubps_avx(auVar98,auVar100);
    auVar92 = vsubps_avx(auVar99,auVar101);
    auVar103 = vmulps_avx512vl(auVar96,auVar235);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar234,auVar92);
    auVar104 = vmulps_avx512vl(auVar92,auVar230);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar235,auVar95);
    auVar105 = vmulps_avx512vl(auVar95,auVar234);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar230,auVar96);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar104 = vmulps_avx512vl(auVar92,auVar92);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,auVar96);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar95,auVar95);
    auVar105 = vrcp14ps_avx512vl(auVar104);
    auVar106 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar112);
    auVar105 = vfmadd132ps_avx512vl(auVar106,auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar105);
    auVar106 = vmulps_avx512vl(auVar96,auVar102);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar89,auVar92);
    auVar107 = vmulps_avx512vl(auVar92,auVar88);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar102,auVar95);
    auVar108 = vmulps_avx512vl(auVar95,auVar89);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar88,auVar96);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vmulps_avx512vl(auVar106,auVar105);
    auVar103 = vmaxps_avx512vl(auVar103,auVar105);
    auVar103 = vsqrtps_avx512vl(auVar103);
    auVar105 = vmaxps_avx512vl(auVar94,auVar90);
    auVar93 = vmaxps_avx512vl(auVar93,auVar105);
    auVar105 = vaddps_avx512vl(auVar103,auVar93);
    auVar93 = vminps_avx(auVar94,auVar90);
    auVar93 = vminps_avx(auVar91,auVar93);
    auVar93 = vsubps_avx512vl(auVar93,auVar103);
    auVar117._8_4_ = 0x3f800002;
    auVar117._0_8_ = 0x3f8000023f800002;
    auVar117._12_4_ = 0x3f800002;
    auVar117._16_4_ = 0x3f800002;
    auVar117._20_4_ = 0x3f800002;
    auVar117._24_4_ = 0x3f800002;
    auVar117._28_4_ = 0x3f800002;
    auVar91 = vmulps_avx512vl(auVar105,auVar117);
    auVar118._8_4_ = 0x3f7ffffc;
    auVar118._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar118._12_4_ = 0x3f7ffffc;
    auVar118._16_4_ = 0x3f7ffffc;
    auVar118._20_4_ = 0x3f7ffffc;
    auVar118._24_4_ = 0x3f7ffffc;
    auVar118._28_4_ = 0x3f7ffffc;
    local_640 = vmulps_avx512vl(auVar93,auVar118);
    auVar93 = vmulps_avx512vl(auVar91,auVar91);
    auVar91 = vrsqrt14ps_avx512vl(auVar104);
    auVar31._8_4_ = 0xbf000000;
    auVar31._0_8_ = 0xbf000000bf000000;
    auVar31._12_4_ = 0xbf000000;
    auVar31._16_4_ = 0xbf000000;
    auVar31._20_4_ = 0xbf000000;
    auVar31._24_4_ = 0xbf000000;
    auVar31._28_4_ = 0xbf000000;
    auVar94 = vmulps_avx512vl(auVar104,auVar31);
    fVar149 = auVar91._0_4_;
    fVar135 = auVar91._4_4_;
    fVar159 = auVar91._8_4_;
    fVar160 = auVar91._12_4_;
    fVar162 = auVar91._16_4_;
    fVar161 = auVar91._20_4_;
    fVar163 = auVar91._24_4_;
    auVar48._4_4_ = fVar135 * fVar135 * fVar135 * auVar94._4_4_;
    auVar48._0_4_ = fVar149 * fVar149 * fVar149 * auVar94._0_4_;
    auVar48._8_4_ = fVar159 * fVar159 * fVar159 * auVar94._8_4_;
    auVar48._12_4_ = fVar160 * fVar160 * fVar160 * auVar94._12_4_;
    auVar48._16_4_ = fVar162 * fVar162 * fVar162 * auVar94._16_4_;
    auVar48._20_4_ = fVar161 * fVar161 * fVar161 * auVar94._20_4_;
    auVar48._24_4_ = fVar163 * fVar163 * fVar163 * auVar94._24_4_;
    auVar48._28_4_ = auVar105._28_4_;
    auVar32._8_4_ = 0x3fc00000;
    auVar32._0_8_ = 0x3fc000003fc00000;
    auVar32._12_4_ = 0x3fc00000;
    auVar32._16_4_ = 0x3fc00000;
    auVar32._20_4_ = 0x3fc00000;
    auVar32._24_4_ = 0x3fc00000;
    auVar32._28_4_ = 0x3fc00000;
    auVar91 = vfmadd231ps_avx512vl(auVar48,auVar91,auVar32);
    auVar94 = vmulps_avx512vl(auVar95,auVar91);
    auVar90 = vmulps_avx512vl(auVar96,auVar91);
    auVar103 = vmulps_avx512vl(auVar92,auVar91);
    auVar205 = ZEXT1632(auVar82);
    auVar104 = vsubps_avx512vl(auVar111,auVar205);
    auVar105 = vsubps_avx512vl(auVar111,auVar100);
    auVar106 = vsubps_avx512vl(auVar111,auVar101);
    auVar59._4_4_ = uStack_3bc;
    auVar59._0_4_ = local_3c0;
    auVar59._8_4_ = uStack_3b8;
    auVar59._12_4_ = uStack_3b4;
    auVar59._16_4_ = uStack_3b0;
    auVar59._20_4_ = uStack_3ac;
    auVar59._24_4_ = uStack_3a8;
    auVar59._28_4_ = uStack_3a4;
    auVar107 = vmulps_avx512vl(auVar59,auVar106);
    auVar107 = vfmadd231ps_avx512vl(auVar107,local_340,auVar105);
    auVar107 = vfmadd231ps_avx512vl(auVar107,local_320,auVar104);
    auVar108 = vmulps_avx512vl(auVar106,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar105);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar104);
    auVar109 = vmulps_avx512vl(auVar59,auVar103);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar90,local_340);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar94,local_320);
    auVar103 = vmulps_avx512vl(auVar106,auVar103);
    auVar90 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar90);
    auVar94 = vfmadd231ps_avx512vl(auVar90,auVar104,auVar94);
    auVar90 = vmulps_avx512vl(auVar109,auVar109);
    auVar103 = vsubps_avx512vl(auVar244._0_32_,auVar90);
    auVar110 = vmulps_avx512vl(auVar109,auVar94);
    auVar107 = vsubps_avx512vl(auVar107,auVar110);
    auVar107 = vaddps_avx512vl(auVar107,auVar107);
    auVar110 = vmulps_avx512vl(auVar94,auVar94);
    local_600 = vsubps_avx512vl(auVar108,auVar110);
    auVar93 = vsubps_avx512vl(local_600,auVar93);
    local_5c0 = vmulps_avx512vl(auVar107,auVar107);
    auVar33._8_4_ = 0x40800000;
    auVar33._0_8_ = 0x4080000040800000;
    auVar33._12_4_ = 0x40800000;
    auVar33._16_4_ = 0x40800000;
    auVar33._20_4_ = 0x40800000;
    auVar33._24_4_ = 0x40800000;
    auVar33._28_4_ = 0x40800000;
    _local_3e0 = vmulps_avx512vl(auVar103,auVar33);
    auVar108 = vmulps_avx512vl(_local_3e0,auVar93);
    auVar108 = vsubps_avx512vl(local_5c0,auVar108);
    uVar70 = vcmpps_avx512vl(auVar108,auVar111,5);
    bVar65 = (byte)uVar70;
    if (bVar65 == 0) {
      auVar227 = ZEXT3264(local_660);
      auVar229 = ZEXT3264(local_680);
      auVar233 = ZEXT3264(local_6a0);
      auVar224 = ZEXT3264(local_620);
      auVar206 = ZEXT3264(local_520);
      auVar218 = ZEXT3264(local_500);
      auVar246 = ZEXT3264(local_7c0);
      auVar236 = ZEXT3264(local_7e0);
      auVar237 = ZEXT3264(local_800);
      auVar238 = ZEXT3264(local_820);
      auVar239 = ZEXT3264(local_840);
      auVar240 = ZEXT3264(local_860);
      auVar241 = ZEXT3264(local_880);
      auVar242 = ZEXT3264(local_8a0);
      auVar243 = ZEXT3264(local_8c0);
      auVar245 = ZEXT3264(local_8e0);
    }
    else {
      auVar110 = _local_3e0;
      auVar108 = vsqrtps_avx512vl(auVar108);
      auVar111 = vaddps_avx512vl(auVar103,auVar103);
      local_5e0 = vrcp14ps_avx512vl(auVar111);
      auVar112 = vfnmadd213ps_avx512vl(local_5e0,auVar111,auVar112);
      auVar112 = vfmadd132ps_avx512vl(auVar112,local_5e0,local_5e0);
      auVar34._8_4_ = 0x80000000;
      auVar34._0_8_ = 0x8000000080000000;
      auVar34._12_4_ = 0x80000000;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      local_4e0 = vxorps_avx512vl(auVar107,auVar34);
      auVar113 = vsubps_avx512vl(local_4e0,auVar108);
      auVar113 = vmulps_avx512vl(auVar113,auVar112);
      in_ZMM31 = ZEXT3264(auVar113);
      auVar108 = vsubps_avx512vl(auVar108,auVar107);
      local_400 = vmulps_avx512vl(auVar108,auVar112);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar108 = vblendmps_avx512vl(auVar108,auVar113);
      auVar114._0_4_ =
           (uint)(bVar65 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar112._0_4_;
      bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar72 * auVar108._4_4_ | (uint)!bVar72 * auVar112._4_4_;
      bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar72 * auVar108._8_4_ | (uint)!bVar72 * auVar112._8_4_;
      bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar72 * auVar108._12_4_ | (uint)!bVar72 * auVar112._12_4_;
      bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar114._16_4_ = (uint)bVar72 * auVar108._16_4_ | (uint)!bVar72 * auVar112._16_4_;
      bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar114._20_4_ = (uint)bVar72 * auVar108._20_4_ | (uint)!bVar72 * auVar112._20_4_;
      bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar114._24_4_ = (uint)bVar72 * auVar108._24_4_ | (uint)!bVar72 * auVar112._24_4_;
      bVar72 = SUB81(uVar70 >> 7,0);
      auVar114._28_4_ = (uint)bVar72 * auVar108._28_4_ | (uint)!bVar72 * auVar112._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar112 = vblendmps_avx512vl(auVar108,local_400);
      auVar115._0_4_ =
           (uint)(bVar65 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar108._0_4_;
      bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar72 * auVar112._4_4_ | (uint)!bVar72 * auVar108._4_4_;
      bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar72 * auVar112._8_4_ | (uint)!bVar72 * auVar108._8_4_;
      bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar72 * auVar112._12_4_ | (uint)!bVar72 * auVar108._12_4_;
      bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar72 * auVar112._16_4_ | (uint)!bVar72 * auVar108._16_4_;
      bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar72 * auVar112._20_4_ | (uint)!bVar72 * auVar108._20_4_;
      bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar72 * auVar112._24_4_ | (uint)!bVar72 * auVar108._24_4_;
      bVar72 = SUB81(uVar70 >> 7,0);
      auVar115._28_4_ = (uint)bVar72 * auVar112._28_4_ | (uint)!bVar72 * auVar108._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar90,auVar108);
      local_420 = vmaxps_avx512vl(local_1e0,auVar108);
      auVar35._8_4_ = 0x36000000;
      auVar35._0_8_ = 0x3600000036000000;
      auVar35._12_4_ = 0x36000000;
      auVar35._16_4_ = 0x36000000;
      auVar35._20_4_ = 0x36000000;
      auVar35._24_4_ = 0x36000000;
      auVar35._28_4_ = 0x36000000;
      local_440 = vmulps_avx512vl(local_420,auVar35);
      vandps_avx512vl(auVar103,auVar108);
      uVar18 = vcmpps_avx512vl(local_440,local_440,1);
      uVar70 = uVar70 & uVar18;
      bVar69 = (byte)uVar70;
      if (bVar69 != 0) {
        uVar18 = vcmpps_avx512vl(auVar93,_DAT_01f7b000,2);
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar103 = vblendmps_avx512vl(auVar93,auVar90);
        bVar67 = (byte)uVar18;
        uVar75 = (uint)(bVar67 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar67 & 1) * local_440._0_4_;
        bVar72 = (bool)((byte)(uVar18 >> 1) & 1);
        uVar128 = (uint)bVar72 * auVar103._4_4_ | (uint)!bVar72 * local_440._4_4_;
        bVar72 = (bool)((byte)(uVar18 >> 2) & 1);
        uVar129 = (uint)bVar72 * auVar103._8_4_ | (uint)!bVar72 * local_440._8_4_;
        bVar72 = (bool)((byte)(uVar18 >> 3) & 1);
        uVar130 = (uint)bVar72 * auVar103._12_4_ | (uint)!bVar72 * local_440._12_4_;
        bVar72 = (bool)((byte)(uVar18 >> 4) & 1);
        uVar131 = (uint)bVar72 * auVar103._16_4_ | (uint)!bVar72 * local_440._16_4_;
        bVar72 = (bool)((byte)(uVar18 >> 5) & 1);
        uVar132 = (uint)bVar72 * auVar103._20_4_ | (uint)!bVar72 * local_440._20_4_;
        bVar72 = (bool)((byte)(uVar18 >> 6) & 1);
        uVar133 = (uint)bVar72 * auVar103._24_4_ | (uint)!bVar72 * local_440._24_4_;
        bVar72 = SUB81(uVar18 >> 7,0);
        uVar134 = (uint)bVar72 * auVar103._28_4_ | (uint)!bVar72 * local_440._28_4_;
        auVar114._0_4_ = (bVar69 & 1) * uVar75 | !(bool)(bVar69 & 1) * auVar114._0_4_;
        bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar114._4_4_ = bVar72 * uVar128 | !bVar72 * auVar114._4_4_;
        bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar114._8_4_ = bVar72 * uVar129 | !bVar72 * auVar114._8_4_;
        bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar114._12_4_ = bVar72 * uVar130 | !bVar72 * auVar114._12_4_;
        bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar114._16_4_ = bVar72 * uVar131 | !bVar72 * auVar114._16_4_;
        bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar114._20_4_ = bVar72 * uVar132 | !bVar72 * auVar114._20_4_;
        bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar114._24_4_ = bVar72 * uVar133 | !bVar72 * auVar114._24_4_;
        bVar72 = SUB81(uVar70 >> 7,0);
        auVar114._28_4_ = bVar72 * uVar134 | !bVar72 * auVar114._28_4_;
        auVar93 = vblendmps_avx512vl(auVar90,auVar93);
        bVar72 = (bool)((byte)(uVar18 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar18 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar18 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar18 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar18 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar18 >> 6) & 1);
        bVar15 = SUB81(uVar18 >> 7,0);
        auVar115._0_4_ =
             (uint)(bVar69 & 1) *
             ((uint)(bVar67 & 1) * auVar93._0_4_ | !(bool)(bVar67 & 1) * uVar75) |
             !(bool)(bVar69 & 1) * auVar115._0_4_;
        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar115._4_4_ =
             (uint)bVar9 * ((uint)bVar72 * auVar93._4_4_ | !bVar72 * uVar128) |
             !bVar9 * auVar115._4_4_;
        bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar115._8_4_ =
             (uint)bVar72 * ((uint)bVar10 * auVar93._8_4_ | !bVar10 * uVar129) |
             !bVar72 * auVar115._8_4_;
        bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar115._12_4_ =
             (uint)bVar72 * ((uint)bVar11 * auVar93._12_4_ | !bVar11 * uVar130) |
             !bVar72 * auVar115._12_4_;
        bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar115._16_4_ =
             (uint)bVar72 * ((uint)bVar12 * auVar93._16_4_ | !bVar12 * uVar131) |
             !bVar72 * auVar115._16_4_;
        bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar115._20_4_ =
             (uint)bVar72 * ((uint)bVar13 * auVar93._20_4_ | !bVar13 * uVar132) |
             !bVar72 * auVar115._20_4_;
        bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar115._24_4_ =
             (uint)bVar72 * ((uint)bVar14 * auVar93._24_4_ | !bVar14 * uVar133) |
             !bVar72 * auVar115._24_4_;
        bVar72 = SUB81(uVar70 >> 7,0);
        auVar115._28_4_ =
             (uint)bVar72 * ((uint)bVar15 * auVar93._28_4_ | !bVar15 * uVar134) |
             !bVar72 * auVar115._28_4_;
        bVar65 = (~bVar69 | bVar67) & bVar65;
      }
      auVar60._4_4_ = uStack_3bc;
      auVar60._0_4_ = local_3c0;
      auVar60._8_4_ = uStack_3b8;
      auVar60._12_4_ = uStack_3b4;
      auVar60._16_4_ = uStack_3b0;
      auVar60._20_4_ = uStack_3ac;
      auVar60._24_4_ = uStack_3a8;
      auVar60._28_4_ = uStack_3a4;
      if ((bVar65 & 0x7f) == 0) {
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      }
      else {
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar102 = vxorps_avx512vl(auVar102,auVar90);
        auVar88 = vxorps_avx512vl(auVar88,auVar90);
        auVar89 = vxorps_avx512vl(auVar89,auVar90);
        auVar78 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_590);
        auVar93 = vbroadcastss_avx512vl(auVar78);
        auVar103 = vmaxps_avx512vl(auVar93,auVar114);
        auVar78 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_590);
        auVar93 = vbroadcastss_avx512vl(auVar78);
        auVar108 = vminps_avx512vl(auVar93,auVar115);
        auVar93 = vmulps_avx512vl(auVar106,auVar235);
        auVar93 = vfmadd213ps_avx512vl(auVar105,auVar234,auVar93);
        auVar78 = vfmadd213ps_fma(auVar104,auVar230,auVar93);
        auVar93 = vmulps_avx512vl(auVar60,auVar235);
        auVar93 = vfmadd231ps_avx512vl(auVar93,local_340,auVar234);
        auVar104 = vfmadd231ps_avx512vl(auVar93,local_320,auVar230);
        auVar231._8_4_ = 0x7fffffff;
        auVar231._0_8_ = 0x7fffffff7fffffff;
        auVar231._12_4_ = 0x7fffffff;
        auVar231._16_4_ = 0x7fffffff;
        auVar231._20_4_ = 0x7fffffff;
        auVar231._24_4_ = 0x7fffffff;
        auVar231._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(auVar231,auVar104);
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar17 = vcmpps_avx512vl(auVar93,auVar105,1);
        auVar106 = vxorps_avx512vl(ZEXT1632(auVar78),auVar90);
        auVar112 = vrcp14ps_avx512vl(auVar104);
        auVar116 = vxorps_avx512vl(auVar104,auVar90);
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar117 = vfnmadd213ps_avx512vl(auVar112,auVar104,auVar93);
        auVar78 = vfmadd132ps_fma(auVar117,auVar112,auVar112);
        fVar149 = auVar78._0_4_ * auVar106._0_4_;
        fVar135 = auVar78._4_4_ * auVar106._4_4_;
        auVar49._4_4_ = fVar135;
        auVar49._0_4_ = fVar149;
        fVar159 = auVar78._8_4_ * auVar106._8_4_;
        auVar49._8_4_ = fVar159;
        fVar160 = auVar78._12_4_ * auVar106._12_4_;
        auVar49._12_4_ = fVar160;
        fVar162 = auVar106._16_4_ * 0.0;
        auVar49._16_4_ = fVar162;
        fVar161 = auVar106._20_4_ * 0.0;
        auVar49._20_4_ = fVar161;
        fVar163 = auVar106._24_4_ * 0.0;
        auVar49._24_4_ = fVar163;
        auVar49._28_4_ = auVar106._28_4_;
        uVar20 = vcmpps_avx512vl(auVar104,auVar116,1);
        bVar69 = (byte)uVar17 | (byte)uVar20;
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar118 = vblendmps_avx512vl(auVar49,auVar117);
        auVar119._0_4_ =
             (uint)(bVar69 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar112._0_4_;
        bVar72 = (bool)(bVar69 >> 1 & 1);
        auVar119._4_4_ = (uint)bVar72 * auVar118._4_4_ | (uint)!bVar72 * auVar112._4_4_;
        bVar72 = (bool)(bVar69 >> 2 & 1);
        auVar119._8_4_ = (uint)bVar72 * auVar118._8_4_ | (uint)!bVar72 * auVar112._8_4_;
        bVar72 = (bool)(bVar69 >> 3 & 1);
        auVar119._12_4_ = (uint)bVar72 * auVar118._12_4_ | (uint)!bVar72 * auVar112._12_4_;
        bVar72 = (bool)(bVar69 >> 4 & 1);
        auVar119._16_4_ = (uint)bVar72 * auVar118._16_4_ | (uint)!bVar72 * auVar112._16_4_;
        bVar72 = (bool)(bVar69 >> 5 & 1);
        auVar119._20_4_ = (uint)bVar72 * auVar118._20_4_ | (uint)!bVar72 * auVar112._20_4_;
        bVar72 = (bool)(bVar69 >> 6 & 1);
        auVar119._24_4_ = (uint)bVar72 * auVar118._24_4_ | (uint)!bVar72 * auVar112._24_4_;
        auVar119._28_4_ =
             (uint)(bVar69 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar112._28_4_;
        auVar103 = vmaxps_avx512vl(auVar103,auVar119);
        uVar20 = vcmpps_avx512vl(auVar104,auVar116,6);
        bVar69 = (byte)uVar17 | (byte)uVar20;
        auVar120._0_4_ = (uint)(bVar69 & 1) * 0x7f800000 | (uint)!(bool)(bVar69 & 1) * (int)fVar149;
        bVar72 = (bool)(bVar69 >> 1 & 1);
        auVar120._4_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar135;
        bVar72 = (bool)(bVar69 >> 2 & 1);
        auVar120._8_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar159;
        bVar72 = (bool)(bVar69 >> 3 & 1);
        auVar120._12_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar160;
        bVar72 = (bool)(bVar69 >> 4 & 1);
        auVar120._16_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar162;
        bVar72 = (bool)(bVar69 >> 5 & 1);
        auVar120._20_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar161;
        bVar72 = (bool)(bVar69 >> 6 & 1);
        auVar120._24_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar163;
        auVar120._28_4_ =
             (uint)(bVar69 >> 7) * 0x7f800000 | (uint)!(bool)(bVar69 >> 7) * auVar106._28_4_;
        auVar104 = vminps_avx512vl(auVar108,auVar120);
        auVar78 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar78),auVar97);
        auVar98 = vsubps_avx512vl(ZEXT1632(auVar78),auVar98);
        auVar106 = ZEXT1632(auVar78);
        auVar99 = vsubps_avx512vl(auVar106,auVar99);
        auVar99 = vmulps_avx512vl(auVar99,auVar102);
        auVar98 = vfmadd231ps_avx512vl(auVar99,auVar89,auVar98);
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar88,auVar97);
        auVar98 = vmulps_avx512vl(auVar60,auVar102);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_340,auVar89);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_320,auVar88);
        auVar36._8_4_ = 0x7fffffff;
        auVar36._0_8_ = 0x7fffffff7fffffff;
        auVar36._12_4_ = 0x7fffffff;
        auVar36._16_4_ = 0x7fffffff;
        auVar36._20_4_ = 0x7fffffff;
        auVar36._24_4_ = 0x7fffffff;
        auVar36._28_4_ = 0x7fffffff;
        vandps_avx512vl(auVar98,auVar36);
        uVar17 = vcmpps_avx512vl(auVar98,auVar105,1);
        auVar97 = vxorps_avx512vl(auVar97,auVar90);
        auVar99 = vrcp14ps_avx512vl(auVar98);
        auVar90 = vxorps_avx512vl(auVar98,auVar90);
        auVar88 = vfnmadd213ps_avx512vl(auVar99,auVar98,auVar93);
        auVar78 = vfmadd132ps_fma(auVar88,auVar99,auVar99);
        fVar149 = auVar78._0_4_ * auVar97._0_4_;
        fVar135 = auVar78._4_4_ * auVar97._4_4_;
        auVar50._4_4_ = fVar135;
        auVar50._0_4_ = fVar149;
        fVar159 = auVar78._8_4_ * auVar97._8_4_;
        auVar50._8_4_ = fVar159;
        fVar160 = auVar78._12_4_ * auVar97._12_4_;
        auVar50._12_4_ = fVar160;
        fVar162 = auVar97._16_4_ * 0.0;
        auVar50._16_4_ = fVar162;
        fVar161 = auVar97._20_4_ * 0.0;
        auVar50._20_4_ = fVar161;
        fVar163 = auVar97._24_4_ * 0.0;
        auVar50._24_4_ = fVar163;
        auVar50._28_4_ = auVar97._28_4_;
        uVar20 = vcmpps_avx512vl(auVar98,auVar90,1);
        bVar69 = (byte)uVar17 | (byte)uVar20;
        auVar88 = vblendmps_avx512vl(auVar50,auVar117);
        auVar121._0_4_ =
             (uint)(bVar69 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar99._0_4_;
        bVar72 = (bool)(bVar69 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar72 * auVar88._4_4_ | (uint)!bVar72 * auVar99._4_4_;
        bVar72 = (bool)(bVar69 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar72 * auVar88._8_4_ | (uint)!bVar72 * auVar99._8_4_;
        bVar72 = (bool)(bVar69 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar72 * auVar88._12_4_ | (uint)!bVar72 * auVar99._12_4_;
        bVar72 = (bool)(bVar69 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar72 * auVar88._16_4_ | (uint)!bVar72 * auVar99._16_4_;
        bVar72 = (bool)(bVar69 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar72 * auVar88._20_4_ | (uint)!bVar72 * auVar99._20_4_;
        bVar72 = (bool)(bVar69 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar72 * auVar88._24_4_ | (uint)!bVar72 * auVar99._24_4_;
        auVar121._28_4_ =
             (uint)(bVar69 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar99._28_4_;
        local_3a0 = vmaxps_avx(auVar103,auVar121);
        uVar20 = vcmpps_avx512vl(auVar98,auVar90,6);
        bVar69 = (byte)uVar17 | (byte)uVar20;
        auVar122._0_4_ = (uint)(bVar69 & 1) * 0x7f800000 | (uint)!(bool)(bVar69 & 1) * (int)fVar149;
        bVar72 = (bool)(bVar69 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar135;
        bVar72 = (bool)(bVar69 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar159;
        bVar72 = (bool)(bVar69 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar160;
        bVar72 = (bool)(bVar69 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar162;
        bVar72 = (bool)(bVar69 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar161;
        bVar72 = (bool)(bVar69 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar163;
        auVar122._28_4_ =
             (uint)(bVar69 >> 7) * 0x7f800000 | (uint)!(bool)(bVar69 >> 7) * auVar97._28_4_;
        local_240 = vminps_avx(auVar104,auVar122);
        uVar17 = vcmpps_avx512vl(local_3a0,local_240,2);
        bVar65 = bVar65 & 0x7f & (byte)uVar17;
        if (bVar65 != 0) {
          auVar98 = vmaxps_avx512vl(auVar106,local_640);
          auVar97 = vfmadd213ps_avx512vl(auVar113,auVar109,auVar94);
          in_ZMM31 = ZEXT3264(auVar97);
          auVar97 = vmulps_avx512vl(auVar91,auVar97);
          auVar99 = vfmadd213ps_avx512vl(local_400,auVar109,auVar94);
          fVar149 = auVar91._0_4_;
          fVar135 = auVar91._4_4_;
          auVar51._4_4_ = fVar135 * auVar99._4_4_;
          auVar51._0_4_ = fVar149 * auVar99._0_4_;
          fVar159 = auVar91._8_4_;
          auVar51._8_4_ = fVar159 * auVar99._8_4_;
          fVar160 = auVar91._12_4_;
          auVar51._12_4_ = fVar160 * auVar99._12_4_;
          fVar162 = auVar91._16_4_;
          auVar51._16_4_ = fVar162 * auVar99._16_4_;
          fVar161 = auVar91._20_4_;
          auVar51._20_4_ = fVar161 * auVar99._20_4_;
          fVar163 = auVar91._24_4_;
          auVar51._24_4_ = fVar163 * auVar99._24_4_;
          auVar51._28_4_ = auVar99._28_4_;
          auVar97 = vminps_avx512vl(auVar97,auVar93);
          auVar99 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar97 = vmaxps_avx(auVar97,ZEXT832(0) << 0x20);
          auVar90 = vminps_avx512vl(auVar51,auVar93);
          auVar52._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
          auVar52._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
          auVar52._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
          auVar52._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
          auVar52._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
          auVar52._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
          auVar52._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
          auVar52._28_4_ = auVar97._28_4_ + 7.0;
          local_1a0 = vfmadd213ps_avx512vl(auVar52,local_720,_local_900);
          auVar97 = vmaxps_avx(auVar90,ZEXT832(0) << 0x20);
          auVar53._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
          auVar53._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
          auVar53._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
          auVar53._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
          auVar53._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
          auVar53._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
          auVar53._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
          auVar53._28_4_ = auVar97._28_4_ + 7.0;
          local_1c0 = vfmadd213ps_avx512vl(auVar53,local_720,_local_900);
          auVar54._4_4_ = auVar98._4_4_ * auVar98._4_4_;
          auVar54._0_4_ = auVar98._0_4_ * auVar98._0_4_;
          auVar54._8_4_ = auVar98._8_4_ * auVar98._8_4_;
          auVar54._12_4_ = auVar98._12_4_ * auVar98._12_4_;
          auVar54._16_4_ = auVar98._16_4_ * auVar98._16_4_;
          auVar54._20_4_ = auVar98._20_4_ * auVar98._20_4_;
          auVar54._24_4_ = auVar98._24_4_ * auVar98._24_4_;
          auVar54._28_4_ = auVar98._28_4_;
          auVar97 = vsubps_avx(local_600,auVar54);
          auVar55._4_4_ = auVar97._4_4_ * (float)local_3e0._4_4_;
          auVar55._0_4_ = auVar97._0_4_ * (float)local_3e0._0_4_;
          auVar55._8_4_ = auVar97._8_4_ * fStack_3d8;
          auVar55._12_4_ = auVar97._12_4_ * fStack_3d4;
          auVar55._16_4_ = auVar97._16_4_ * fStack_3d0;
          auVar55._20_4_ = auVar97._20_4_ * fStack_3cc;
          auVar55._24_4_ = auVar97._24_4_ * fStack_3c8;
          auVar55._28_4_ = auVar98._28_4_;
          auVar98 = vsubps_avx(local_5c0,auVar55);
          uVar17 = vcmpps_avx512vl(auVar98,ZEXT832(0) << 0x20,5);
          bVar69 = (byte)uVar17;
          auVar244 = ZEXT3264(local_740);
          if (bVar69 == 0) {
            bVar69 = 0;
            auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar206 = ZEXT864(0) << 0x20;
            auVar98 = SUB6432(ZEXT864(0),0) << 0x20;
            auVar90 = SUB6432(ZEXT864(0),0) << 0x20;
            auVar226 = ZEXT1228(ZEXT812(0)) << 0x20;
            auVar123._8_4_ = 0x7f800000;
            auVar123._0_8_ = 0x7f8000007f800000;
            auVar123._12_4_ = 0x7f800000;
            auVar123._16_4_ = 0x7f800000;
            auVar123._20_4_ = 0x7f800000;
            auVar123._24_4_ = 0x7f800000;
            auVar123._28_4_ = 0x7f800000;
            auVar124._8_4_ = 0xff800000;
            auVar124._0_8_ = 0xff800000ff800000;
            auVar124._12_4_ = 0xff800000;
            auVar124._16_4_ = 0xff800000;
            auVar124._20_4_ = 0xff800000;
            auVar124._24_4_ = 0xff800000;
            auVar124._28_4_ = 0xff800000;
          }
          else {
            auVar79 = vxorps_avx512vl(auVar207,auVar207);
            uVar70 = vcmpps_avx512vl(auVar98,auVar106,5);
            auVar98 = vsqrtps_avx(auVar98);
            auVar93 = vfnmadd213ps_avx512vl(auVar111,local_5e0,auVar93);
            auVar99 = vfmadd132ps_avx512vl(auVar93,local_5e0,local_5e0);
            auVar93 = vsubps_avx(local_4e0,auVar98);
            auVar88 = vmulps_avx512vl(auVar93,auVar99);
            auVar93 = vsubps_avx512vl(auVar98,auVar107);
            auVar89 = vmulps_avx512vl(auVar93,auVar99);
            auVar93 = vfmadd213ps_avx512vl(auVar109,auVar88,auVar94);
            auVar56._4_4_ = fVar135 * auVar93._4_4_;
            auVar56._0_4_ = fVar149 * auVar93._0_4_;
            auVar56._8_4_ = fVar159 * auVar93._8_4_;
            auVar56._12_4_ = fVar160 * auVar93._12_4_;
            auVar56._16_4_ = fVar162 * auVar93._16_4_;
            auVar56._20_4_ = fVar161 * auVar93._20_4_;
            auVar56._24_4_ = fVar163 * auVar93._24_4_;
            auVar56._28_4_ = auVar90._28_4_;
            auVar93 = vmulps_avx512vl(local_320,auVar88);
            auVar99 = vmulps_avx512vl(local_340,auVar88);
            auVar61._4_4_ = uStack_3bc;
            auVar61._0_4_ = local_3c0;
            auVar61._8_4_ = uStack_3b8;
            auVar61._12_4_ = uStack_3b4;
            auVar61._16_4_ = uStack_3b0;
            auVar61._20_4_ = uStack_3ac;
            auVar61._24_4_ = uStack_3a8;
            auVar61._28_4_ = uStack_3a4;
            auVar102 = vmulps_avx512vl(auVar61,auVar88);
            auVar98 = vfmadd213ps_avx512vl(auVar95,auVar56,auVar205);
            auVar98 = vsubps_avx512vl(auVar93,auVar98);
            auVar93 = vfmadd213ps_avx512vl(auVar96,auVar56,auVar100);
            auVar90 = vsubps_avx512vl(auVar99,auVar93);
            auVar78 = vfmadd213ps_fma(auVar56,auVar92,auVar101);
            auVar93 = vsubps_avx(auVar102,ZEXT1632(auVar78));
            auVar226 = auVar93._0_28_;
            auVar93 = vfmadd213ps_avx512vl(auVar109,auVar89,auVar94);
            auVar57._4_4_ = fVar135 * auVar93._4_4_;
            auVar57._0_4_ = fVar149 * auVar93._0_4_;
            auVar57._8_4_ = fVar159 * auVar93._8_4_;
            auVar57._12_4_ = fVar160 * auVar93._12_4_;
            auVar57._16_4_ = fVar162 * auVar93._16_4_;
            auVar57._20_4_ = fVar161 * auVar93._20_4_;
            auVar57._24_4_ = fVar163 * auVar93._24_4_;
            auVar57._28_4_ = auVar91._28_4_;
            auVar93 = vmulps_avx512vl(local_320,auVar89);
            auVar91 = vmulps_avx512vl(local_340,auVar89);
            auVar94 = vmulps_avx512vl(auVar61,auVar89);
            auVar78 = vfmadd213ps_fma(auVar95,auVar57,auVar205);
            auVar99 = vsubps_avx(auVar93,ZEXT1632(auVar78));
            auVar78 = vfmadd213ps_fma(auVar96,auVar57,auVar100);
            auVar93 = vsubps_avx(auVar91,ZEXT1632(auVar78));
            auVar78 = vfmadd213ps_fma(auVar92,auVar57,auVar101);
            auVar91 = vsubps_avx512vl(auVar94,ZEXT1632(auVar78));
            auVar206 = ZEXT3264(auVar91);
            auVar180._8_4_ = 0x7f800000;
            auVar180._0_8_ = 0x7f8000007f800000;
            auVar180._12_4_ = 0x7f800000;
            auVar180._16_4_ = 0x7f800000;
            auVar180._20_4_ = 0x7f800000;
            auVar180._24_4_ = 0x7f800000;
            auVar180._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar180,auVar88);
            bVar72 = (bool)((byte)uVar70 & 1);
            auVar123._0_4_ = (uint)bVar72 * auVar91._0_4_ | (uint)!bVar72 * auVar82._0_4_;
            bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar123._4_4_ = (uint)bVar72 * auVar91._4_4_ | (uint)!bVar72 * auVar82._4_4_;
            bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar123._8_4_ = (uint)bVar72 * auVar91._8_4_ | (uint)!bVar72 * auVar82._8_4_;
            bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar123._12_4_ = (uint)bVar72 * auVar91._12_4_ | (uint)!bVar72 * auVar82._12_4_;
            iVar1 = (uint)((byte)(uVar70 >> 4) & 1) * auVar91._16_4_;
            auVar123._16_4_ = iVar1;
            iVar2 = (uint)((byte)(uVar70 >> 5) & 1) * auVar91._20_4_;
            auVar123._20_4_ = iVar2;
            iVar3 = (uint)((byte)(uVar70 >> 6) & 1) * auVar91._24_4_;
            auVar123._24_4_ = iVar3;
            iVar4 = (uint)(byte)(uVar70 >> 7) * auVar91._28_4_;
            auVar123._28_4_ = iVar4;
            auVar181._8_4_ = 0xff800000;
            auVar181._0_8_ = 0xff800000ff800000;
            auVar181._12_4_ = 0xff800000;
            auVar181._16_4_ = 0xff800000;
            auVar181._20_4_ = 0xff800000;
            auVar181._24_4_ = 0xff800000;
            auVar181._28_4_ = 0xff800000;
            auVar91 = vblendmps_avx512vl(auVar181,auVar89);
            bVar72 = (bool)((byte)uVar70 & 1);
            auVar124._0_4_ = (uint)bVar72 * auVar91._0_4_ | (uint)!bVar72 * -0x800000;
            bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar124._4_4_ = (uint)bVar72 * auVar91._4_4_ | (uint)!bVar72 * -0x800000;
            bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar124._8_4_ = (uint)bVar72 * auVar91._8_4_ | (uint)!bVar72 * -0x800000;
            bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar124._12_4_ = (uint)bVar72 * auVar91._12_4_ | (uint)!bVar72 * -0x800000;
            bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar124._16_4_ = (uint)bVar72 * auVar91._16_4_ | (uint)!bVar72 * -0x800000;
            bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar124._20_4_ = (uint)bVar72 * auVar91._20_4_ | (uint)!bVar72 * -0x800000;
            bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar124._24_4_ = (uint)bVar72 * auVar91._24_4_ | (uint)!bVar72 * -0x800000;
            bVar72 = SUB81(uVar70 >> 7,0);
            auVar124._28_4_ = (uint)bVar72 * auVar91._28_4_ | (uint)!bVar72 * -0x800000;
            auVar37._8_4_ = 0x36000000;
            auVar37._0_8_ = 0x3600000036000000;
            auVar37._12_4_ = 0x36000000;
            auVar37._16_4_ = 0x36000000;
            auVar37._20_4_ = 0x36000000;
            auVar37._24_4_ = 0x36000000;
            auVar37._28_4_ = 0x36000000;
            auVar91 = vmulps_avx512vl(local_420,auVar37);
            uVar18 = vcmpps_avx512vl(auVar91,local_440,0xe);
            uVar70 = uVar70 & uVar18;
            bVar67 = (byte)uVar70;
            if (bVar67 != 0) {
              uVar18 = vcmpps_avx512vl(auVar97,ZEXT1632(auVar79),2);
              auVar222._8_4_ = 0x7f800000;
              auVar222._0_8_ = 0x7f8000007f800000;
              auVar222._12_4_ = 0x7f800000;
              auVar222._16_4_ = 0x7f800000;
              auVar222._20_4_ = 0x7f800000;
              auVar222._24_4_ = 0x7f800000;
              auVar222._28_4_ = 0x7f800000;
              auVar232._8_4_ = 0xff800000;
              auVar232._0_8_ = 0xff800000ff800000;
              auVar232._12_4_ = 0xff800000;
              auVar232._16_4_ = 0xff800000;
              auVar232._20_4_ = 0xff800000;
              auVar232._24_4_ = 0xff800000;
              auVar232._28_4_ = 0xff800000;
              auVar94 = vblendmps_avx512vl(auVar222,auVar232);
              bVar66 = (byte)uVar18;
              uVar75 = (uint)(bVar66 & 1) * auVar94._0_4_ |
                       (uint)!(bool)(bVar66 & 1) * auVar91._0_4_;
              bVar72 = (bool)((byte)(uVar18 >> 1) & 1);
              uVar128 = (uint)bVar72 * auVar94._4_4_ | (uint)!bVar72 * auVar91._4_4_;
              bVar72 = (bool)((byte)(uVar18 >> 2) & 1);
              uVar129 = (uint)bVar72 * auVar94._8_4_ | (uint)!bVar72 * auVar91._8_4_;
              bVar72 = (bool)((byte)(uVar18 >> 3) & 1);
              uVar130 = (uint)bVar72 * auVar94._12_4_ | (uint)!bVar72 * auVar91._12_4_;
              bVar72 = (bool)((byte)(uVar18 >> 4) & 1);
              uVar131 = (uint)bVar72 * auVar94._16_4_ | (uint)!bVar72 * auVar91._16_4_;
              bVar72 = (bool)((byte)(uVar18 >> 5) & 1);
              uVar132 = (uint)bVar72 * auVar94._20_4_ | (uint)!bVar72 * auVar91._20_4_;
              bVar72 = (bool)((byte)(uVar18 >> 6) & 1);
              uVar133 = (uint)bVar72 * auVar94._24_4_ | (uint)!bVar72 * auVar91._24_4_;
              bVar72 = SUB81(uVar18 >> 7,0);
              uVar134 = (uint)bVar72 * auVar94._28_4_ | (uint)!bVar72 * auVar91._28_4_;
              auVar123._0_4_ = (bVar67 & 1) * uVar75 | !(bool)(bVar67 & 1) * auVar123._0_4_;
              bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar123._4_4_ = bVar72 * uVar128 | !bVar72 * auVar123._4_4_;
              bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar123._8_4_ = bVar72 * uVar129 | !bVar72 * auVar123._8_4_;
              bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar123._12_4_ = bVar72 * uVar130 | !bVar72 * auVar123._12_4_;
              bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar123._16_4_ = bVar72 * uVar131 | (uint)!bVar72 * iVar1;
              bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar123._20_4_ = bVar72 * uVar132 | (uint)!bVar72 * iVar2;
              bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar123._24_4_ = bVar72 * uVar133 | (uint)!bVar72 * iVar3;
              bVar72 = SUB81(uVar70 >> 7,0);
              auVar123._28_4_ = bVar72 * uVar134 | (uint)!bVar72 * iVar4;
              auVar91 = vblendmps_avx512vl(auVar232,auVar222);
              bVar72 = (bool)((byte)(uVar18 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar18 >> 2) & 1);
              bVar11 = (bool)((byte)(uVar18 >> 3) & 1);
              bVar12 = (bool)((byte)(uVar18 >> 4) & 1);
              bVar13 = (bool)((byte)(uVar18 >> 5) & 1);
              bVar14 = (bool)((byte)(uVar18 >> 6) & 1);
              bVar15 = SUB81(uVar18 >> 7,0);
              auVar124._0_4_ =
                   (uint)(bVar67 & 1) *
                   ((uint)(bVar66 & 1) * auVar91._0_4_ | !(bool)(bVar66 & 1) * uVar75) |
                   !(bool)(bVar67 & 1) * auVar124._0_4_;
              bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar124._4_4_ =
                   (uint)bVar9 * ((uint)bVar72 * auVar91._4_4_ | !bVar72 * uVar128) |
                   !bVar9 * auVar124._4_4_;
              bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar124._8_4_ =
                   (uint)bVar72 * ((uint)bVar10 * auVar91._8_4_ | !bVar10 * uVar129) |
                   !bVar72 * auVar124._8_4_;
              bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar124._12_4_ =
                   (uint)bVar72 * ((uint)bVar11 * auVar91._12_4_ | !bVar11 * uVar130) |
                   !bVar72 * auVar124._12_4_;
              bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar124._16_4_ =
                   (uint)bVar72 * ((uint)bVar12 * auVar91._16_4_ | !bVar12 * uVar131) |
                   !bVar72 * auVar124._16_4_;
              bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar124._20_4_ =
                   (uint)bVar72 * ((uint)bVar13 * auVar91._20_4_ | !bVar13 * uVar132) |
                   !bVar72 * auVar124._20_4_;
              bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar124._24_4_ =
                   (uint)bVar72 * ((uint)bVar14 * auVar91._24_4_ | !bVar14 * uVar133) |
                   !bVar72 * auVar124._24_4_;
              bVar72 = SUB81(uVar70 >> 7,0);
              auVar124._28_4_ =
                   (uint)bVar72 * ((uint)bVar15 * auVar91._28_4_ | !bVar15 * uVar134) |
                   !bVar72 * auVar124._28_4_;
              bVar69 = (~bVar67 | bVar66) & bVar69;
            }
          }
          auVar246 = ZEXT3264(local_7c0);
          auVar236 = ZEXT3264(local_7e0);
          auVar237 = ZEXT3264(local_800);
          auVar238 = ZEXT3264(local_820);
          auVar239 = ZEXT3264(local_840);
          auVar240 = ZEXT3264(local_860);
          auVar241 = ZEXT3264(local_880);
          auVar242 = ZEXT3264(local_8a0);
          auVar243 = ZEXT3264(local_8c0);
          auVar245 = ZEXT3264(local_8e0);
          uVar136 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          auVar217._4_4_ = uVar136;
          auVar217._0_4_ = uVar136;
          auVar217._8_4_ = uVar136;
          auVar217._12_4_ = uVar136;
          auVar217._16_4_ = uVar136;
          auVar217._20_4_ = uVar136;
          auVar217._24_4_ = uVar136;
          auVar217._28_4_ = uVar136;
          uVar136 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          auVar223._4_4_ = uVar136;
          auVar223._0_4_ = uVar136;
          auVar223._8_4_ = uVar136;
          auVar223._12_4_ = uVar136;
          auVar223._16_4_ = uVar136;
          auVar223._20_4_ = uVar136;
          auVar223._24_4_ = uVar136;
          auVar223._28_4_ = uVar136;
          fVar149 = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar224._0_4_ = fVar149 * auVar206._0_4_;
          auVar224._4_4_ = fVar149 * auVar206._4_4_;
          auVar224._8_4_ = fVar149 * auVar206._8_4_;
          auVar224._12_4_ = fVar149 * auVar206._12_4_;
          auVar224._16_4_ = fVar149 * auVar206._16_4_;
          auVar224._20_4_ = fVar149 * auVar206._20_4_;
          auVar224._28_36_ = auVar206._28_36_;
          auVar224._24_4_ = fVar149 * auVar206._24_4_;
          auVar78 = vfmadd231ps_fma(auVar224._0_32_,auVar223,auVar93);
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar217,auVar99);
          _local_2a0 = local_3a0;
          local_280 = vminps_avx(local_240,auVar123);
          auVar228._8_4_ = 0x7fffffff;
          auVar228._0_8_ = 0x7fffffff7fffffff;
          auVar228._12_4_ = 0x7fffffff;
          auVar228._16_4_ = 0x7fffffff;
          auVar228._20_4_ = 0x7fffffff;
          auVar228._24_4_ = 0x7fffffff;
          auVar228._28_4_ = 0x7fffffff;
          auVar93 = vandps_avx(auVar228,ZEXT1632(auVar78));
          _local_260 = vmaxps_avx(local_3a0,auVar124);
          auVar213._8_4_ = 0x3e99999a;
          auVar213._0_8_ = 0x3e99999a3e99999a;
          auVar213._12_4_ = 0x3e99999a;
          auVar213._16_4_ = 0x3e99999a;
          auVar213._20_4_ = 0x3e99999a;
          auVar213._24_4_ = 0x3e99999a;
          auVar213._28_4_ = 0x3e99999a;
          uVar17 = vcmpps_avx512vl(auVar93,auVar213,1);
          uVar20 = vcmpps_avx512vl(local_3a0,local_280,2);
          bVar67 = (byte)uVar20 & bVar65;
          uVar19 = vcmpps_avx512vl(_local_260,local_240,2);
          if ((bVar65 & ((byte)uVar19 | (byte)uVar20)) == 0) {
            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar247 = ZEXT3264(auVar93);
            auVar227 = ZEXT3264(local_660);
            auVar229 = ZEXT3264(local_680);
            auVar233 = ZEXT3264(local_6a0);
            auVar224 = ZEXT3264(local_620);
            auVar206 = ZEXT3264(local_520);
            auVar218 = ZEXT3264(local_500);
          }
          else {
            _local_360 = _local_260;
            local_748 = (uint)(byte)((byte)uVar17 | ~bVar69);
            auVar58._4_4_ = auVar226._4_4_ * fVar149;
            auVar58._0_4_ = auVar226._0_4_ * fVar149;
            auVar58._8_4_ = auVar226._8_4_ * fVar149;
            auVar58._12_4_ = auVar226._12_4_ * fVar149;
            auVar58._16_4_ = auVar226._16_4_ * fVar149;
            auVar58._20_4_ = auVar226._20_4_ * fVar149;
            auVar58._24_4_ = auVar226._24_4_ * fVar149;
            auVar58._28_4_ = local_260._28_4_;
            auVar78 = vfmadd213ps_fma(auVar90,auVar223,auVar58);
            auVar78 = vfmadd213ps_fma(auVar98,auVar217,ZEXT1632(auVar78));
            auVar93 = vandps_avx(auVar228,ZEXT1632(auVar78));
            uVar17 = vcmpps_avx512vl(auVar93,auVar213,1);
            bVar69 = (byte)uVar17 | ~bVar69;
            auVar144._8_4_ = 2;
            auVar144._0_8_ = 0x200000002;
            auVar144._12_4_ = 2;
            auVar144._16_4_ = 2;
            auVar144._20_4_ = 2;
            auVar144._24_4_ = 2;
            auVar144._28_4_ = 2;
            auVar38._8_4_ = 3;
            auVar38._0_8_ = 0x300000003;
            auVar38._12_4_ = 3;
            auVar38._16_4_ = 3;
            auVar38._20_4_ = 3;
            auVar38._24_4_ = 3;
            auVar38._28_4_ = 3;
            auVar93 = vpblendmd_avx512vl(auVar144,auVar38);
            local_220._0_4_ = (uint)(bVar69 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar69 & 1) * 2;
            bVar72 = (bool)(bVar69 >> 1 & 1);
            local_220._4_4_ = (uint)bVar72 * auVar93._4_4_ | (uint)!bVar72 * 2;
            bVar72 = (bool)(bVar69 >> 2 & 1);
            local_220._8_4_ = (uint)bVar72 * auVar93._8_4_ | (uint)!bVar72 * 2;
            bVar72 = (bool)(bVar69 >> 3 & 1);
            local_220._12_4_ = (uint)bVar72 * auVar93._12_4_ | (uint)!bVar72 * 2;
            bVar72 = (bool)(bVar69 >> 4 & 1);
            local_220._16_4_ = (uint)bVar72 * auVar93._16_4_ | (uint)!bVar72 * 2;
            bVar72 = (bool)(bVar69 >> 5 & 1);
            local_220._20_4_ = (uint)bVar72 * auVar93._20_4_ | (uint)!bVar72 * 2;
            bVar72 = (bool)(bVar69 >> 6 & 1);
            local_220._24_4_ = (uint)bVar72 * auVar93._24_4_ | (uint)!bVar72 * 2;
            local_220._28_4_ = (uint)(bVar69 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar69 >> 7) * 2
            ;
            local_2c0 = vpbroadcastd_avx512vl();
            uVar17 = vpcmpd_avx512vl(local_2c0,local_220,5);
            local_744 = (uint)bVar67;
            local_300 = local_3a0._0_4_ + (float)local_380._0_4_;
            fStack_2fc = local_3a0._4_4_ + (float)local_380._4_4_;
            fStack_2f8 = local_3a0._8_4_ + fStack_378;
            fStack_2f4 = local_3a0._12_4_ + fStack_374;
            fStack_2f0 = local_3a0._16_4_ + fStack_370;
            fStack_2ec = local_3a0._20_4_ + fStack_36c;
            fStack_2e8 = local_3a0._24_4_ + fStack_368;
            fStack_2e4 = local_3a0._28_4_ + fStack_364;
            _local_3e0 = auVar110;
            for (bVar67 = (byte)uVar17 & bVar67; auVar93 = _local_900, bVar67 != 0;
                bVar67 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar67 & (byte)uVar17) {
              auVar145._8_4_ = 0x7f800000;
              auVar145._0_8_ = 0x7f8000007f800000;
              auVar145._12_4_ = 0x7f800000;
              auVar145._16_4_ = 0x7f800000;
              auVar145._20_4_ = 0x7f800000;
              auVar145._24_4_ = 0x7f800000;
              auVar145._28_4_ = 0x7f800000;
              auVar91 = vblendmps_avx512vl(auVar145,local_3a0);
              auVar125._0_4_ =
                   (uint)(bVar67 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
              bVar72 = (bool)(bVar67 >> 1 & 1);
              auVar125._4_4_ = (uint)bVar72 * auVar91._4_4_ | (uint)!bVar72 * 0x7f800000;
              bVar72 = (bool)(bVar67 >> 2 & 1);
              auVar125._8_4_ = (uint)bVar72 * auVar91._8_4_ | (uint)!bVar72 * 0x7f800000;
              bVar72 = (bool)(bVar67 >> 3 & 1);
              auVar125._12_4_ = (uint)bVar72 * auVar91._12_4_ | (uint)!bVar72 * 0x7f800000;
              bVar72 = (bool)(bVar67 >> 4 & 1);
              auVar125._16_4_ = (uint)bVar72 * auVar91._16_4_ | (uint)!bVar72 * 0x7f800000;
              bVar72 = (bool)(bVar67 >> 5 & 1);
              auVar125._20_4_ = (uint)bVar72 * auVar91._20_4_ | (uint)!bVar72 * 0x7f800000;
              bVar72 = (bool)(bVar67 >> 6 & 1);
              auVar125._24_4_ = (uint)bVar72 * auVar91._24_4_ | (uint)!bVar72 * 0x7f800000;
              auVar125._28_4_ =
                   (uint)(bVar67 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar67 >> 7) * 0x7f800000;
              auVar91 = vshufps_avx(auVar125,auVar125,0xb1);
              auVar91 = vminps_avx(auVar125,auVar91);
              auVar94 = vshufpd_avx(auVar91,auVar91,5);
              auVar91 = vminps_avx(auVar91,auVar94);
              auVar94 = vpermpd_avx2(auVar91,0x4e);
              auVar91 = vminps_avx(auVar91,auVar94);
              uVar17 = vcmpps_avx512vl(auVar125,auVar91,0);
              bVar66 = (byte)uVar17 & bVar67;
              bVar69 = bVar67;
              if (bVar66 != 0) {
                bVar69 = bVar66;
              }
              iVar1 = 0;
              for (uVar75 = (uint)bVar69; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                iVar1 = iVar1 + 1;
              }
              aVar5 = (ray->super_RayK<1>).dir.field_0;
              local_600._0_16_ = (undefined1  [16])aVar5;
              auVar78 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
              if (auVar78._0_4_ < 0.0) {
                local_900[1] = 0;
                local_900[0] = bVar67;
                stack0xfffffffffffff702 = auVar93._2_30_;
                local_720._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
                local_640._0_16_ = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar1 << 2)));
                fVar149 = sqrtf(auVar78._0_4_);
                bVar67 = local_900[0];
                auVar244 = ZEXT3264(local_740);
                auVar245 = ZEXT3264(local_8e0);
                auVar243 = ZEXT3264(local_8c0);
                auVar242 = ZEXT3264(local_8a0);
                auVar241 = ZEXT3264(local_880);
                auVar240 = ZEXT3264(local_860);
                auVar239 = ZEXT3264(local_840);
                auVar238 = ZEXT3264(local_820);
                auVar237 = ZEXT3264(local_800);
                auVar236 = ZEXT3264(local_7e0);
                auVar246 = ZEXT3264(local_7c0);
                auVar78 = local_720._0_16_;
                auVar79 = local_640._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                fVar149 = auVar78._0_4_;
                auVar78 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
                auVar79 = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar1 << 2)));
              }
              auVar80 = vminps_avx(local_460._0_16_,local_4a0._0_16_);
              auVar81 = vmaxps_avx(local_460._0_16_,local_4a0._0_16_);
              auVar76 = vminps_avx(local_480._0_16_,local_4c0._0_16_);
              auVar82 = vminps_avx(auVar80,auVar76);
              auVar80 = vmaxps_avx(local_480._0_16_,local_4c0._0_16_);
              auVar76 = vmaxps_avx(auVar81,auVar80);
              auVar186._8_4_ = 0x7fffffff;
              auVar186._0_8_ = 0x7fffffff7fffffff;
              auVar186._12_4_ = 0x7fffffff;
              auVar81 = vandps_avx(auVar82,auVar186);
              auVar80 = vandps_avx(auVar76,auVar186);
              auVar81 = vmaxps_avx(auVar81,auVar80);
              auVar80 = vmovshdup_avx(auVar81);
              auVar80 = vmaxss_avx(auVar80,auVar81);
              auVar81 = vshufpd_avx(auVar81,auVar81,1);
              auVar81 = vmaxss_avx(auVar81,auVar80);
              fVar135 = auVar81._0_4_ * 1.9073486e-06;
              local_580 = vshufps_avx(auVar76,auVar76,0xff);
              auVar78 = vinsertps_avx(auVar79,auVar78,0x10);
              auVar206 = ZEXT1664(auVar78);
              lVar71 = 5;
              do {
                do {
                  auVar78 = auVar206._0_16_;
                  bVar72 = lVar71 == 0;
                  lVar71 = lVar71 + -1;
                  if (bVar72) goto LAB_01a6f297;
                  uVar136 = auVar206._0_4_;
                  auVar137._4_4_ = uVar136;
                  auVar137._0_4_ = uVar136;
                  auVar137._8_4_ = uVar136;
                  auVar137._12_4_ = uVar136;
                  auVar81 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_600._0_16_);
                  auVar79 = vmovshdup_avx(auVar78);
                  local_4e0._0_16_ = auVar79;
                  fVar163 = 1.0 - auVar79._0_4_;
                  auVar79 = vshufps_avx(auVar78,auVar78,0x55);
                  fVar159 = auVar79._0_4_;
                  auVar166._0_4_ = local_4a0._0_4_ * fVar159;
                  fVar160 = auVar79._4_4_;
                  auVar166._4_4_ = local_4a0._4_4_ * fVar160;
                  fVar162 = auVar79._8_4_;
                  auVar166._8_4_ = local_4a0._8_4_ * fVar162;
                  fVar161 = auVar79._12_4_;
                  auVar166._12_4_ = local_4a0._12_4_ * fVar161;
                  local_400._0_16_ = ZEXT416((uint)fVar163);
                  auVar187._4_4_ = fVar163;
                  auVar187._0_4_ = fVar163;
                  auVar187._8_4_ = fVar163;
                  auVar187._12_4_ = fVar163;
                  auVar79 = vfmadd231ps_fma(auVar166,auVar187,local_460._0_16_);
                  auVar201._0_4_ = local_480._0_4_ * fVar159;
                  auVar201._4_4_ = local_480._4_4_ * fVar160;
                  auVar201._8_4_ = local_480._8_4_ * fVar162;
                  auVar201._12_4_ = local_480._12_4_ * fVar161;
                  auVar80 = vfmadd231ps_fma(auVar201,auVar187,local_4a0._0_16_);
                  auVar208._0_4_ = fVar159 * (float)local_4c0._0_4_;
                  auVar208._4_4_ = fVar160 * (float)local_4c0._4_4_;
                  auVar208._8_4_ = fVar162 * fStack_4b8;
                  auVar208._12_4_ = fVar161 * fStack_4b4;
                  auVar76 = vfmadd231ps_fma(auVar208,auVar187,local_480._0_16_);
                  auVar214._0_4_ = fVar159 * auVar80._0_4_;
                  auVar214._4_4_ = fVar160 * auVar80._4_4_;
                  auVar214._8_4_ = fVar162 * auVar80._8_4_;
                  auVar214._12_4_ = fVar161 * auVar80._12_4_;
                  auVar79 = vfmadd231ps_fma(auVar214,auVar187,auVar79);
                  auVar167._0_4_ = fVar159 * auVar76._0_4_;
                  auVar167._4_4_ = fVar160 * auVar76._4_4_;
                  auVar167._8_4_ = fVar162 * auVar76._8_4_;
                  auVar167._12_4_ = fVar161 * auVar76._12_4_;
                  auVar80 = vfmadd231ps_fma(auVar167,auVar187,auVar80);
                  auVar202._0_4_ = fVar159 * auVar80._0_4_;
                  auVar202._4_4_ = fVar160 * auVar80._4_4_;
                  auVar202._8_4_ = fVar162 * auVar80._8_4_;
                  auVar202._12_4_ = fVar161 * auVar80._12_4_;
                  auVar76 = vfmadd231ps_fma(auVar202,auVar79,auVar187);
                  auVar79 = vsubps_avx(auVar80,auVar79);
                  auVar21._8_4_ = 0x40400000;
                  auVar21._0_8_ = 0x4040000040400000;
                  auVar21._12_4_ = 0x40400000;
                  auVar80 = vmulps_avx512vl(auVar79,auVar21);
                  _local_3e0 = auVar76;
                  auVar81 = vsubps_avx(auVar81,auVar76);
                  auVar79 = vdpps_avx(auVar81,auVar81,0x7f);
                  local_5c0._0_16_ = auVar78;
                  _local_900 = auVar80;
                  local_720._0_16_ = auVar81;
                  local_640._0_16_ = auVar79;
                  if (auVar79._0_4_ < 0.0) {
                    auVar227._0_4_ = sqrtf(auVar79._0_4_);
                    auVar227._4_60_ = extraout_var;
                    auVar78 = auVar227._0_16_;
                    auVar80 = _local_900;
                  }
                  else {
                    auVar78 = vsqrtss_avx(auVar79,auVar79);
                  }
                  local_420._0_16_ = vdpps_avx(auVar80,auVar80,0x7f);
                  fVar159 = local_420._0_4_;
                  auVar168._4_12_ = ZEXT812(0) << 0x20;
                  auVar168._0_4_ = fVar159;
                  local_6f0 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
                  fVar160 = local_6f0._0_4_;
                  local_440._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
                  auVar22._8_4_ = 0x80000000;
                  auVar22._0_8_ = 0x8000000080000000;
                  auVar22._12_4_ = 0x80000000;
                  auVar81 = vxorps_avx512vl(local_420._0_16_,auVar22);
                  auVar79 = vfnmadd213ss_fma(local_440._0_16_,local_420._0_16_,ZEXT416(0x40000000));
                  local_530._0_4_ = auVar79._0_4_;
                  local_5e0._0_4_ = auVar78._0_4_;
                  if (fVar159 < auVar81._0_4_) {
                    local_790._0_4_ = fVar159 * -0.5;
                    auVar229._0_4_ = sqrtf(fVar159);
                    auVar229._4_60_ = extraout_var_00;
                    auVar78 = ZEXT416((uint)local_5e0._0_4_);
                    auVar79 = auVar229._0_16_;
                    fVar159 = (float)local_790._0_4_;
                    auVar80 = _local_900;
                  }
                  else {
                    auVar79 = vsqrtss_avx512f(local_420._0_16_,local_420._0_16_);
                    fVar159 = fVar159 * -0.5;
                  }
                  fVar162 = local_6f0._0_4_;
                  fVar159 = fVar160 * 1.5 + fVar159 * fVar162 * fVar162 * fVar162;
                  local_6f0._0_4_ = auVar80._0_4_ * fVar159;
                  local_6f0._4_4_ = auVar80._4_4_ * fVar159;
                  local_6f0._8_4_ = auVar80._8_4_ * fVar159;
                  local_6f0._12_4_ = auVar80._12_4_ * fVar159;
                  auVar81 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
                  fVar162 = auVar78._0_4_;
                  auVar138._0_4_ = auVar81._0_4_ * auVar81._0_4_;
                  auVar138._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                  auVar138._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                  auVar138._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                  auVar76 = vsubps_avx(local_640._0_16_,auVar138);
                  fVar160 = auVar76._0_4_;
                  auVar150._4_12_ = ZEXT812(0) << 0x20;
                  auVar150._0_4_ = fVar160;
                  auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar150);
                  auVar77 = vmulss_avx512f(auVar82,ZEXT416(0x3fc00000));
                  auVar83 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
                  if (fVar160 < 0.0) {
                    local_540._0_4_ = auVar79._0_4_;
                    local_560._0_4_ = auVar77._0_4_;
                    local_570._4_4_ = fVar159;
                    local_570._0_4_ = fVar159;
                    fStack_568 = fVar159;
                    fStack_564 = fVar159;
                    local_790 = auVar81;
                    local_550 = auVar82;
                    fVar160 = sqrtf(fVar160);
                    auVar83 = ZEXT416(auVar83._0_4_);
                    auVar77 = ZEXT416((uint)local_560._0_4_);
                    auVar79 = ZEXT416((uint)local_540._0_4_);
                    auVar78 = ZEXT416((uint)local_5e0._0_4_);
                    auVar81 = local_790;
                    auVar80 = _local_900;
                    auVar82 = local_550;
                    fVar159 = (float)local_570._0_4_;
                    fVar161 = (float)local_570._4_4_;
                    fVar163 = fStack_568;
                    fVar164 = fStack_564;
                  }
                  else {
                    auVar76 = vsqrtss_avx(auVar76,auVar76);
                    fVar160 = auVar76._0_4_;
                    fVar161 = fVar159;
                    fVar163 = fVar159;
                    fVar164 = fVar159;
                  }
                  auVar246 = ZEXT3264(local_7c0);
                  auVar236 = ZEXT3264(local_7e0);
                  auVar237 = ZEXT3264(local_800);
                  auVar238 = ZEXT3264(local_820);
                  auVar239 = ZEXT3264(local_840);
                  auVar240 = ZEXT3264(local_860);
                  auVar241 = ZEXT3264(local_880);
                  auVar242 = ZEXT3264(local_8a0);
                  auVar243 = ZEXT3264(local_8c0);
                  auVar245 = ZEXT3264(local_8e0);
                  auVar244 = ZEXT3264(local_740);
                  auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_400._0_16_,
                                            local_4e0._0_16_);
                  auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                            local_400._0_16_);
                  fVar165 = auVar76._0_4_ * 6.0;
                  fVar16 = local_4e0._0_4_ * 6.0;
                  auVar188._0_4_ = fVar16 * (float)local_4c0._0_4_;
                  auVar188._4_4_ = fVar16 * (float)local_4c0._4_4_;
                  auVar188._8_4_ = fVar16 * fStack_4b8;
                  auVar188._12_4_ = fVar16 * fStack_4b4;
                  auVar169._4_4_ = fVar165;
                  auVar169._0_4_ = fVar165;
                  auVar169._8_4_ = fVar165;
                  auVar169._12_4_ = fVar165;
                  auVar76 = vfmadd132ps_fma(auVar169,auVar188,local_480._0_16_);
                  fVar165 = auVar86._0_4_ * 6.0;
                  auVar151._4_4_ = fVar165;
                  auVar151._0_4_ = fVar165;
                  auVar151._8_4_ = fVar165;
                  auVar151._12_4_ = fVar165;
                  auVar76 = vfmadd132ps_fma(auVar151,auVar76,local_4a0._0_16_);
                  fVar165 = local_400._0_4_ * 6.0;
                  auVar170._4_4_ = fVar165;
                  auVar170._0_4_ = fVar165;
                  auVar170._8_4_ = fVar165;
                  auVar170._12_4_ = fVar165;
                  auVar76 = vfmadd132ps_fma(auVar170,auVar76,local_460._0_16_);
                  auVar152._0_4_ = auVar76._0_4_ * (float)local_420._0_4_;
                  auVar152._4_4_ = auVar76._4_4_ * (float)local_420._0_4_;
                  auVar152._8_4_ = auVar76._8_4_ * (float)local_420._0_4_;
                  auVar152._12_4_ = auVar76._12_4_ * (float)local_420._0_4_;
                  auVar76 = vdpps_avx(auVar80,auVar76,0x7f);
                  fVar165 = auVar76._0_4_;
                  auVar171._0_4_ = auVar80._0_4_ * fVar165;
                  auVar171._4_4_ = auVar80._4_4_ * fVar165;
                  auVar171._8_4_ = auVar80._8_4_ * fVar165;
                  auVar171._12_4_ = auVar80._12_4_ * fVar165;
                  auVar76 = vsubps_avx(auVar152,auVar171);
                  fVar165 = (float)local_530._0_4_ * (float)local_440._0_4_;
                  auVar86 = vmaxss_avx(ZEXT416((uint)fVar135),
                                       ZEXT416((uint)(local_5c0._0_4_ * fVar149 * 1.9073486e-06)));
                  auVar23._8_4_ = 0x80000000;
                  auVar23._0_8_ = 0x8000000080000000;
                  auVar23._12_4_ = 0x80000000;
                  auVar84 = vxorps_avx512vl(auVar80,auVar23);
                  auVar172._0_4_ = fVar159 * auVar76._0_4_ * fVar165;
                  auVar172._4_4_ = fVar161 * auVar76._4_4_ * fVar165;
                  auVar172._8_4_ = fVar163 * auVar76._8_4_ * fVar165;
                  auVar172._12_4_ = fVar164 * auVar76._12_4_ * fVar165;
                  auVar76 = vdpps_avx(auVar84,local_6f0,0x7f);
                  auVar85 = vdivss_avx512f(ZEXT416((uint)fVar135),auVar79);
                  auVar79 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar135),auVar86);
                  auVar78 = vdpps_avx(local_720._0_16_,auVar172,0x7f);
                  auVar85 = vfmadd213ss_fma(ZEXT416((uint)(fVar162 + 1.0)),auVar85,auVar79);
                  fVar159 = auVar76._0_4_ + auVar78._0_4_;
                  auVar78 = vdpps_avx(local_600._0_16_,local_6f0,0x7f);
                  auVar79 = vdpps_avx(local_720._0_16_,auVar84,0x7f);
                  auVar76 = vmulss_avx512f(auVar83,auVar82);
                  auVar82 = vmulss_avx512f(auVar82,auVar82);
                  auVar83 = vaddss_avx512f(auVar77,ZEXT416((uint)(auVar76._0_4_ * auVar82._0_4_)));
                  auVar76 = vdpps_avx(local_720._0_16_,local_600._0_16_,0x7f);
                  auVar77 = vfnmadd231ss_fma(auVar79,auVar81,ZEXT416((uint)fVar159));
                  auVar76 = vfnmadd231ss_fma(auVar76,auVar81,auVar78);
                  auVar79 = vpermilps_avx(_local_3e0,0xff);
                  fVar160 = fVar160 - auVar79._0_4_;
                  auVar82 = vshufps_avx(auVar80,auVar80,0xff);
                  auVar79 = vfmsub213ss_fma(auVar77,auVar83,auVar82);
                  auVar220._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
                  auVar220._8_4_ = auVar79._8_4_ ^ 0x80000000;
                  auVar220._12_4_ = auVar79._12_4_ ^ 0x80000000;
                  auVar76 = ZEXT416((uint)(auVar76._0_4_ * auVar83._0_4_));
                  auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar79._0_4_)),
                                            ZEXT416((uint)fVar159),auVar76);
                  auVar79 = vinsertps_avx(auVar220,auVar76,0x1c);
                  auVar209._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
                  auVar209._8_4_ = auVar78._8_4_ ^ 0x80000000;
                  auVar209._12_4_ = auVar78._12_4_ ^ 0x80000000;
                  auVar76 = vinsertps_avx(ZEXT416((uint)fVar159),auVar209,0x10);
                  auVar189._0_4_ = auVar77._0_4_;
                  auVar189._4_4_ = auVar189._0_4_;
                  auVar189._8_4_ = auVar189._0_4_;
                  auVar189._12_4_ = auVar189._0_4_;
                  auVar78 = vdivps_avx(auVar79,auVar189);
                  auVar79 = vdivps_avx(auVar76,auVar189);
                  auVar76 = vbroadcastss_avx512vl(auVar81);
                  auVar190._0_4_ = auVar76._0_4_ * auVar78._0_4_ + fVar160 * auVar79._0_4_;
                  auVar190._4_4_ = auVar76._4_4_ * auVar78._4_4_ + fVar160 * auVar79._4_4_;
                  auVar190._8_4_ = auVar76._8_4_ * auVar78._8_4_ + fVar160 * auVar79._8_4_;
                  auVar190._12_4_ = auVar76._12_4_ * auVar78._12_4_ + fVar160 * auVar79._12_4_;
                  auVar78 = vsubps_avx(local_5c0._0_16_,auVar190);
                  auVar206 = ZEXT1664(auVar78);
                  auVar24._8_4_ = 0x7fffffff;
                  auVar24._0_8_ = 0x7fffffff7fffffff;
                  auVar24._12_4_ = 0x7fffffff;
                  auVar79 = vandps_avx512vl(auVar81,auVar24);
                } while (auVar85._0_4_ <= auVar79._0_4_);
                auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar85._0_4_ + auVar86._0_4_)),local_580,
                                          ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx512vl(ZEXT416((uint)fVar160),auVar25);
              } while (auVar79._0_4_ <= auVar81._0_4_);
              fVar149 = auVar78._0_4_ + (float)local_590._0_4_;
              if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar149) &&
                 (fVar135 = (ray->super_RayK<1>).tfar, fVar149 <= fVar135)) {
                auVar78 = vmovshdup_avx(auVar78);
                fVar159 = auVar78._0_4_;
                if ((0.0 <= fVar159) && (fVar159 <= 1.0)) {
                  auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_640._0_4_));
                  fVar160 = auVar78._0_4_;
                  pGVar7 = (context->scene->geometries).items[local_910].ptr;
                  if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                    fVar160 = fVar160 * 1.5 + local_640._0_4_ * -0.5 * fVar160 * fVar160 * fVar160;
                    auVar191._0_4_ = local_720._0_4_ * fVar160;
                    auVar191._4_4_ = local_720._4_4_ * fVar160;
                    auVar191._8_4_ = local_720._8_4_ * fVar160;
                    auVar191._12_4_ = local_720._12_4_ * fVar160;
                    auVar76 = vfmadd213ps_fma(auVar82,auVar191,auVar80);
                    auVar78 = vshufps_avx(auVar191,auVar191,0xc9);
                    auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                    auVar192._0_4_ = auVar191._0_4_ * auVar79._0_4_;
                    auVar192._4_4_ = auVar191._4_4_ * auVar79._4_4_;
                    auVar192._8_4_ = auVar191._8_4_ * auVar79._8_4_;
                    auVar192._12_4_ = auVar191._12_4_ * auVar79._12_4_;
                    auVar81 = vfmsub231ps_fma(auVar192,auVar80,auVar78);
                    auVar78 = vshufps_avx(auVar81,auVar81,0xc9);
                    auVar79 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                    auVar139._0_4_ = auVar76._0_4_ * auVar81._0_4_;
                    auVar139._4_4_ = auVar76._4_4_ * auVar81._4_4_;
                    auVar139._8_4_ = auVar76._8_4_ * auVar81._8_4_;
                    auVar139._12_4_ = auVar76._12_4_ * auVar81._12_4_;
                    auVar79 = vfmsub231ps_fma(auVar139,auVar78,auVar79);
                    auVar78 = vshufps_avx(auVar79,auVar79,0xe9);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar149;
                      uVar17 = vmovlps_avx(auVar78);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar17;
                      (ray->Ng).field_0.field_0.z = auVar79._0_4_;
                      ray->u = fVar159;
                      ray->v = 0.0;
                      ray->primID = (uint)local_908;
                      ray->geomID = (uint)local_910;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      local_900._0_4_ = fVar135;
                      local_6e0 = vmovlps_avx(auVar78);
                      local_6d8 = auVar79._0_4_;
                      local_6d4 = fVar159;
                      local_6d0 = 0;
                      local_6cc = (uint)local_908;
                      local_6c8 = (uint)local_910;
                      local_6c4 = context->user->instID[0];
                      local_6c0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = fVar149;
                      local_914 = -1;
                      local_780.valid = &local_914;
                      local_780.geometryUserPtr = pGVar7->userPtr;
                      local_780.context = context->user;
                      local_780.ray = (RTCRayN *)ray;
                      local_780.hit = (RTCHitN *)&local_6e0;
                      local_780.N = 1;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a6f3ef:
                        p_Var8 = context->args->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var8)(&local_780);
                          auVar244 = ZEXT3264(local_740);
                          auVar245 = ZEXT3264(local_8e0);
                          auVar243 = ZEXT3264(local_8c0);
                          auVar242 = ZEXT3264(local_8a0);
                          auVar241 = ZEXT3264(local_880);
                          auVar240 = ZEXT3264(local_860);
                          auVar239 = ZEXT3264(local_840);
                          auVar238 = ZEXT3264(local_820);
                          auVar237 = ZEXT3264(local_800);
                          auVar236 = ZEXT3264(local_7e0);
                          auVar246 = ZEXT3264(local_7c0);
                          if (*local_780.valid == 0) goto LAB_01a6f4e3;
                        }
                        (((Vec3f *)((long)local_780.ray + 0x30))->field_0).components[0] =
                             *(float *)local_780.hit;
                        (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_780.hit + 4);
                        (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_780.hit + 8);
                        *(float *)((long)local_780.ray + 0x3c) = *(float *)(local_780.hit + 0xc);
                        *(float *)((long)local_780.ray + 0x40) = *(float *)(local_780.hit + 0x10);
                        *(float *)((long)local_780.ray + 0x44) = *(float *)(local_780.hit + 0x14);
                        *(float *)((long)local_780.ray + 0x48) = *(float *)(local_780.hit + 0x18);
                        *(float *)((long)local_780.ray + 0x4c) = *(float *)(local_780.hit + 0x1c);
                        *(float *)((long)local_780.ray + 0x50) = *(float *)(local_780.hit + 0x20);
                      }
                      else {
                        (*pGVar7->intersectionFilterN)(&local_780);
                        auVar244 = ZEXT3264(local_740);
                        auVar245 = ZEXT3264(local_8e0);
                        auVar243 = ZEXT3264(local_8c0);
                        auVar242 = ZEXT3264(local_8a0);
                        auVar241 = ZEXT3264(local_880);
                        auVar240 = ZEXT3264(local_860);
                        auVar239 = ZEXT3264(local_840);
                        auVar238 = ZEXT3264(local_820);
                        auVar237 = ZEXT3264(local_800);
                        auVar236 = ZEXT3264(local_7e0);
                        auVar246 = ZEXT3264(local_7c0);
                        if (*local_780.valid != 0) goto LAB_01a6f3ef;
LAB_01a6f4e3:
                        (ray->super_RayK<1>).tfar = (float)local_900._0_4_;
                      }
                    }
                  }
                }
              }
LAB_01a6f297:
              auVar62._4_4_ = fStack_2fc;
              auVar62._0_4_ = local_300;
              auVar62._8_4_ = fStack_2f8;
              auVar62._12_4_ = fStack_2f4;
              auVar62._16_4_ = fStack_2f0;
              auVar62._20_4_ = fStack_2ec;
              auVar62._24_4_ = fStack_2e8;
              auVar62._28_4_ = fStack_2e4;
              fVar149 = (ray->super_RayK<1>).tfar;
              auVar39._4_4_ = fVar149;
              auVar39._0_4_ = fVar149;
              auVar39._8_4_ = fVar149;
              auVar39._12_4_ = fVar149;
              auVar39._16_4_ = fVar149;
              auVar39._20_4_ = fVar149;
              auVar39._24_4_ = fVar149;
              auVar39._28_4_ = fVar149;
              uVar17 = vcmpps_avx512vl(auVar62,auVar39,2);
            }
            auVar156._0_4_ = (float)local_380._0_4_ + (float)local_360._0_4_;
            auVar156._4_4_ = (float)local_380._4_4_ + (float)local_360._4_4_;
            auVar156._8_4_ = fStack_378 + fStack_358;
            auVar156._12_4_ = fStack_374 + fStack_354;
            auVar156._16_4_ = fStack_370 + fStack_350;
            auVar156._20_4_ = fStack_36c + fStack_34c;
            auVar156._24_4_ = fStack_368 + fStack_348;
            auVar156._28_4_ = fStack_364 + fStack_344;
            fVar135 = (ray->super_RayK<1>).tfar;
            fVar149 = (ray->super_RayK<1>).tfar;
            auVar40._4_4_ = fVar149;
            auVar40._0_4_ = fVar149;
            auVar40._8_4_ = fVar149;
            auVar40._12_4_ = fVar149;
            auVar40._16_4_ = fVar149;
            auVar40._20_4_ = fVar149;
            auVar40._24_4_ = fVar149;
            auVar40._28_4_ = fVar149;
            uVar17 = vcmpps_avx512vl(auVar156,auVar40,2);
            auVar157._8_4_ = 2;
            auVar157._0_8_ = 0x200000002;
            auVar157._12_4_ = 2;
            auVar157._16_4_ = 2;
            auVar157._20_4_ = 2;
            auVar157._24_4_ = 2;
            auVar157._28_4_ = 2;
            auVar41._8_4_ = 3;
            auVar41._0_8_ = 0x300000003;
            auVar41._12_4_ = 3;
            auVar41._16_4_ = 3;
            auVar41._20_4_ = 3;
            auVar41._24_4_ = 3;
            auVar41._28_4_ = 3;
            auVar93 = vpblendmd_avx512vl(auVar157,auVar41);
            bVar72 = (bool)((byte)local_748 & 1);
            local_360._0_4_ = (uint)bVar72 * auVar93._0_4_ | (uint)!bVar72 * 2;
            bVar72 = (bool)((byte)(local_748 >> 1) & 1);
            local_360._4_4_ = (uint)bVar72 * auVar93._4_4_ | (uint)!bVar72 * 2;
            bVar72 = (bool)((byte)(local_748 >> 2) & 1);
            fStack_358 = (float)((uint)bVar72 * auVar93._8_4_ | (uint)!bVar72 * 2);
            bVar72 = (bool)((byte)(local_748 >> 3) & 1);
            fStack_354 = (float)((uint)bVar72 * auVar93._12_4_ | (uint)!bVar72 * 2);
            bVar72 = (bool)((byte)(local_748 >> 4) & 1);
            fStack_350 = (float)((uint)bVar72 * auVar93._16_4_ | (uint)!bVar72 * 2);
            bVar72 = (bool)((byte)(local_748 >> 5) & 1);
            fStack_34c = (float)((uint)bVar72 * auVar93._20_4_ | (uint)!bVar72 * 2);
            bVar72 = (bool)((byte)(local_748 >> 6) & 1);
            fStack_348 = (float)((uint)bVar72 * auVar93._24_4_ | (uint)!bVar72 * 2);
            bVar72 = (bool)((byte)(local_748 >> 7) & 1);
            fStack_344 = (float)((uint)bVar72 * auVar93._28_4_ | (uint)!bVar72 * 2);
            bVar65 = (byte)uVar19 & bVar65 & (byte)uVar17;
            uVar17 = vpcmpd_avx512vl(_local_360,local_2c0,2);
            bVar69 = (byte)uVar17 & bVar65;
            local_3a0 = _local_260;
            local_300 = (float)local_380._0_4_ + (float)local_260._0_4_;
            fStack_2fc = (float)local_380._4_4_ + (float)local_260._4_4_;
            fStack_2f8 = fStack_378 + fStack_258;
            fStack_2f4 = fStack_374 + fStack_254;
            fStack_2f0 = fStack_370 + fStack_250;
            fStack_2ec = fStack_36c + fStack_24c;
            fStack_2e8 = fStack_368 + fStack_248;
            fStack_2e4 = fStack_364 + fStack_244;
            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar227 = ZEXT3264(local_660);
            auVar229 = ZEXT3264(local_680);
            auVar233 = ZEXT3264(local_6a0);
            auVar224 = ZEXT3264(local_620);
            while( true ) {
              auVar91 = _local_900;
              auVar247 = ZEXT3264(auVar93);
              auVar218 = ZEXT3264(local_500);
              if (bVar69 == 0) break;
              auVar146._8_4_ = 0x7f800000;
              auVar146._0_8_ = 0x7f8000007f800000;
              auVar146._12_4_ = 0x7f800000;
              auVar146._16_4_ = 0x7f800000;
              auVar146._20_4_ = 0x7f800000;
              auVar146._24_4_ = 0x7f800000;
              auVar146._28_4_ = 0x7f800000;
              auVar93 = vblendmps_avx512vl(auVar146,local_3a0);
              auVar126._0_4_ =
                   (uint)(bVar69 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000;
              bVar72 = (bool)(bVar69 >> 1 & 1);
              auVar126._4_4_ = (uint)bVar72 * auVar93._4_4_ | (uint)!bVar72 * 0x7f800000;
              bVar72 = (bool)(bVar69 >> 2 & 1);
              auVar126._8_4_ = (uint)bVar72 * auVar93._8_4_ | (uint)!bVar72 * 0x7f800000;
              bVar72 = (bool)(bVar69 >> 3 & 1);
              auVar126._12_4_ = (uint)bVar72 * auVar93._12_4_ | (uint)!bVar72 * 0x7f800000;
              bVar72 = (bool)(bVar69 >> 4 & 1);
              auVar126._16_4_ = (uint)bVar72 * auVar93._16_4_ | (uint)!bVar72 * 0x7f800000;
              bVar72 = (bool)(bVar69 >> 5 & 1);
              auVar126._20_4_ = (uint)bVar72 * auVar93._20_4_ | (uint)!bVar72 * 0x7f800000;
              bVar72 = (bool)(bVar69 >> 6 & 1);
              auVar126._24_4_ = (uint)bVar72 * auVar93._24_4_ | (uint)!bVar72 * 0x7f800000;
              auVar126._28_4_ =
                   (uint)(bVar69 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar69 >> 7) * 0x7f800000;
              auVar93 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar93 = vminps_avx(auVar126,auVar93);
              auVar94 = vshufpd_avx(auVar93,auVar93,5);
              auVar93 = vminps_avx(auVar93,auVar94);
              auVar94 = vpermpd_avx2(auVar93,0x4e);
              auVar93 = vminps_avx(auVar93,auVar94);
              uVar17 = vcmpps_avx512vl(auVar126,auVar93,0);
              bVar66 = (byte)uVar17 & bVar69;
              bVar67 = bVar69;
              if (bVar66 != 0) {
                bVar67 = bVar66;
              }
              iVar1 = 0;
              for (uVar75 = (uint)bVar67; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                iVar1 = iVar1 + 1;
              }
              aVar5 = (ray->super_RayK<1>).dir.field_0;
              local_640._0_16_ = (undefined1  [16])aVar5;
              auVar78 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
              if (auVar78._0_4_ < 0.0) {
                local_900[1] = 0;
                local_900[0] = bVar69;
                stack0xfffffffffffff702 = auVar91._2_30_;
                local_720._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
                local_600._0_16_ = ZEXT416(*(uint *)(local_240 + (uint)(iVar1 << 2)));
                fVar149 = sqrtf(auVar78._0_4_);
                bVar69 = local_900[0];
                auVar244 = ZEXT3264(local_740);
                auVar245 = ZEXT3264(local_8e0);
                auVar243 = ZEXT3264(local_8c0);
                auVar242 = ZEXT3264(local_8a0);
                auVar241 = ZEXT3264(local_880);
                auVar240 = ZEXT3264(local_860);
                auVar239 = ZEXT3264(local_840);
                auVar238 = ZEXT3264(local_820);
                auVar237 = ZEXT3264(local_800);
                auVar236 = ZEXT3264(local_7e0);
                auVar246 = ZEXT3264(local_7c0);
                auVar224 = ZEXT3264(local_620);
                auVar233 = ZEXT3264(local_6a0);
                auVar229 = ZEXT3264(local_680);
                auVar227 = ZEXT3264(local_660);
                auVar78 = local_720._0_16_;
                auVar79 = local_600._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                fVar149 = auVar78._0_4_;
                auVar78 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
                auVar79 = ZEXT416(*(uint *)(local_240 + (uint)(iVar1 << 2)));
              }
              auVar80 = vminps_avx(local_460._0_16_,local_4a0._0_16_);
              auVar81 = vmaxps_avx(local_460._0_16_,local_4a0._0_16_);
              auVar76 = vminps_avx(local_480._0_16_,local_4c0._0_16_);
              auVar82 = vminps_avx(auVar80,auVar76);
              auVar80 = vmaxps_avx(local_480._0_16_,local_4c0._0_16_);
              auVar76 = vmaxps_avx(auVar81,auVar80);
              auVar193._8_4_ = 0x7fffffff;
              auVar193._0_8_ = 0x7fffffff7fffffff;
              auVar193._12_4_ = 0x7fffffff;
              auVar81 = vandps_avx(auVar82,auVar193);
              auVar80 = vandps_avx(auVar76,auVar193);
              auVar81 = vmaxps_avx(auVar81,auVar80);
              auVar80 = vmovshdup_avx(auVar81);
              auVar80 = vmaxss_avx(auVar80,auVar81);
              auVar81 = vshufpd_avx(auVar81,auVar81,1);
              auVar81 = vmaxss_avx(auVar81,auVar80);
              fVar135 = auVar81._0_4_ * 1.9073486e-06;
              local_580 = vshufps_avx(auVar76,auVar76,0xff);
              auVar78 = vinsertps_avx(auVar79,auVar78,0x10);
              auVar206 = ZEXT1664(auVar78);
              lVar71 = 5;
              do {
                do {
                  auVar78 = auVar206._0_16_;
                  bVar72 = lVar71 == 0;
                  lVar71 = lVar71 + -1;
                  if (bVar72) goto LAB_01a6fe33;
                  uVar136 = auVar206._0_4_;
                  auVar140._4_4_ = uVar136;
                  auVar140._0_4_ = uVar136;
                  auVar140._8_4_ = uVar136;
                  auVar140._12_4_ = uVar136;
                  auVar81 = vfmadd132ps_fma(auVar140,ZEXT816(0) << 0x40,local_640._0_16_);
                  auVar79 = vmovshdup_avx(auVar78);
                  local_420._0_16_ = auVar79;
                  fVar163 = 1.0 - auVar79._0_4_;
                  auVar79 = vshufps_avx(auVar78,auVar78,0x55);
                  fVar159 = auVar79._0_4_;
                  auVar173._0_4_ = local_4a0._0_4_ * fVar159;
                  fVar160 = auVar79._4_4_;
                  auVar173._4_4_ = local_4a0._4_4_ * fVar160;
                  fVar162 = auVar79._8_4_;
                  auVar173._8_4_ = local_4a0._8_4_ * fVar162;
                  fVar161 = auVar79._12_4_;
                  auVar173._12_4_ = local_4a0._12_4_ * fVar161;
                  local_400._0_16_ = ZEXT416((uint)fVar163);
                  auVar194._4_4_ = fVar163;
                  auVar194._0_4_ = fVar163;
                  auVar194._8_4_ = fVar163;
                  auVar194._12_4_ = fVar163;
                  auVar79 = vfmadd231ps_fma(auVar173,auVar194,local_460._0_16_);
                  auVar203._0_4_ = local_480._0_4_ * fVar159;
                  auVar203._4_4_ = local_480._4_4_ * fVar160;
                  auVar203._8_4_ = local_480._8_4_ * fVar162;
                  auVar203._12_4_ = local_480._12_4_ * fVar161;
                  auVar80 = vfmadd231ps_fma(auVar203,auVar194,local_4a0._0_16_);
                  auVar210._0_4_ = fVar159 * (float)local_4c0._0_4_;
                  auVar210._4_4_ = fVar160 * (float)local_4c0._4_4_;
                  auVar210._8_4_ = fVar162 * fStack_4b8;
                  auVar210._12_4_ = fVar161 * fStack_4b4;
                  auVar76 = vfmadd231ps_fma(auVar210,auVar194,local_480._0_16_);
                  auVar215._0_4_ = fVar159 * auVar80._0_4_;
                  auVar215._4_4_ = fVar160 * auVar80._4_4_;
                  auVar215._8_4_ = fVar162 * auVar80._8_4_;
                  auVar215._12_4_ = fVar161 * auVar80._12_4_;
                  auVar79 = vfmadd231ps_fma(auVar215,auVar194,auVar79);
                  auVar174._0_4_ = fVar159 * auVar76._0_4_;
                  auVar174._4_4_ = fVar160 * auVar76._4_4_;
                  auVar174._8_4_ = fVar162 * auVar76._8_4_;
                  auVar174._12_4_ = fVar161 * auVar76._12_4_;
                  auVar80 = vfmadd231ps_fma(auVar174,auVar194,auVar80);
                  auVar204._0_4_ = fVar159 * auVar80._0_4_;
                  auVar204._4_4_ = fVar160 * auVar80._4_4_;
                  auVar204._8_4_ = fVar162 * auVar80._8_4_;
                  auVar204._12_4_ = fVar161 * auVar80._12_4_;
                  auVar76 = vfmadd231ps_fma(auVar204,auVar79,auVar194);
                  auVar79 = vsubps_avx(auVar80,auVar79);
                  auVar26._8_4_ = 0x40400000;
                  auVar26._0_8_ = 0x4040000040400000;
                  auVar26._12_4_ = 0x40400000;
                  auVar80 = vmulps_avx512vl(auVar79,auVar26);
                  _local_3e0 = auVar76;
                  auVar79 = vsubps_avx(auVar81,auVar76);
                  _local_900 = auVar79;
                  auVar79 = vdpps_avx(auVar79,auVar79,0x7f);
                  local_600._0_16_ = auVar79;
                  local_5c0._0_16_ = auVar78;
                  local_720._0_16_ = auVar80;
                  if (auVar79._0_4_ < 0.0) {
                    auVar233._0_4_ = sqrtf(auVar79._0_4_);
                    auVar233._4_60_ = extraout_var_01;
                    auVar78 = auVar233._0_16_;
                    auVar80 = local_720._0_16_;
                  }
                  else {
                    auVar78 = vsqrtss_avx(auVar79,auVar79);
                  }
                  local_440._0_16_ = vdpps_avx(auVar80,auVar80,0x7f);
                  fVar159 = local_440._0_4_;
                  auVar175._4_12_ = ZEXT812(0) << 0x20;
                  auVar175._0_4_ = fVar159;
                  local_5e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar175);
                  fVar160 = local_5e0._0_4_;
                  local_530 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar175);
                  auVar27._8_4_ = 0x80000000;
                  auVar27._0_8_ = 0x8000000080000000;
                  auVar27._12_4_ = 0x80000000;
                  auVar81 = vxorps_avx512vl(local_440._0_16_,auVar27);
                  auVar79 = vfnmadd213ss_fma(local_530,local_440._0_16_,ZEXT416(0x40000000));
                  local_6f0._0_4_ = auVar79._0_4_;
                  local_4e0._0_4_ = auVar78._0_4_;
                  if (fVar159 < auVar81._0_4_) {
                    local_790._0_4_ = fVar159 * -0.5;
                    fVar162 = sqrtf(fVar159);
                    auVar78 = ZEXT416((uint)local_4e0._0_4_);
                    fVar159 = (float)local_790._0_4_;
                    auVar80 = local_720._0_16_;
                  }
                  else {
                    auVar79 = vsqrtss_avx(local_440._0_16_,local_440._0_16_);
                    fVar162 = auVar79._0_4_;
                    fVar159 = fVar159 * -0.5;
                  }
                  fVar161 = local_5e0._0_4_;
                  auVar76 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(fVar160 * 1.5 +
                                                     fVar159 * fVar161 * fVar161 * fVar161)));
                  auVar81 = vmulps_avx512vl(auVar80,auVar76);
                  local_5e0._0_16_ = vdpps_avx(auVar81,_local_900,0x7f);
                  auVar77 = vaddss_avx512f(auVar78,ZEXT416(0x3f800000));
                  auVar141._0_4_ = local_5e0._0_4_ * local_5e0._0_4_;
                  auVar141._4_4_ = local_5e0._4_4_ * local_5e0._4_4_;
                  auVar141._8_4_ = local_5e0._8_4_ * local_5e0._8_4_;
                  auVar141._12_4_ = local_5e0._12_4_ * local_5e0._12_4_;
                  auVar79 = vsubps_avx(local_600._0_16_,auVar141);
                  fVar159 = auVar79._0_4_;
                  auVar153._4_12_ = ZEXT812(0) << 0x20;
                  auVar153._0_4_ = fVar159;
                  auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar153);
                  auVar83 = vmulss_avx512f(auVar82,ZEXT416(0x3fc00000));
                  auVar86 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
                  uVar74 = fVar159 == 0.0;
                  uVar73 = fVar159 < 0.0;
                  if ((bool)uVar73) {
                    local_790._0_4_ = fVar162;
                    local_550._0_4_ = auVar83._0_4_;
                    _local_570 = auVar76;
                    local_560 = auVar81;
                    local_540 = auVar82;
                    fVar159 = sqrtf(fVar159);
                    auVar86 = ZEXT416(auVar86._0_4_);
                    auVar83 = ZEXT416((uint)local_550._0_4_);
                    auVar78 = ZEXT416((uint)local_4e0._0_4_);
                    auVar77 = ZEXT416(auVar77._0_4_);
                    auVar81 = local_560;
                    auVar82 = local_540;
                    auVar80 = local_720._0_16_;
                    auVar76 = _local_570;
                    fVar162 = (float)local_790._0_4_;
                  }
                  else {
                    auVar79 = vsqrtss_avx(auVar79,auVar79);
                    fVar159 = auVar79._0_4_;
                  }
                  auVar227 = ZEXT3264(local_660);
                  auVar229 = ZEXT3264(local_680);
                  auVar233 = ZEXT3264(local_6a0);
                  auVar246 = ZEXT3264(local_7c0);
                  auVar236 = ZEXT3264(local_7e0);
                  auVar237 = ZEXT3264(local_800);
                  auVar238 = ZEXT3264(local_820);
                  auVar239 = ZEXT3264(local_840);
                  auVar240 = ZEXT3264(local_860);
                  auVar241 = ZEXT3264(local_880);
                  auVar242 = ZEXT3264(local_8a0);
                  auVar243 = ZEXT3264(local_8c0);
                  auVar245 = ZEXT3264(local_8e0);
                  auVar244 = ZEXT3264(local_740);
                  auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_400._0_16_,
                                            local_420._0_16_);
                  auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_420._0_16_,
                                            local_400._0_16_);
                  fVar160 = auVar79._0_4_ * 6.0;
                  fVar161 = local_420._0_4_ * 6.0;
                  auVar195._0_4_ = fVar161 * (float)local_4c0._0_4_;
                  auVar195._4_4_ = fVar161 * (float)local_4c0._4_4_;
                  auVar195._8_4_ = fVar161 * fStack_4b8;
                  auVar195._12_4_ = fVar161 * fStack_4b4;
                  auVar176._4_4_ = fVar160;
                  auVar176._0_4_ = fVar160;
                  auVar176._8_4_ = fVar160;
                  auVar176._12_4_ = fVar160;
                  auVar79 = vfmadd132ps_fma(auVar176,auVar195,local_480._0_16_);
                  fVar160 = auVar85._0_4_ * 6.0;
                  auVar154._4_4_ = fVar160;
                  auVar154._0_4_ = fVar160;
                  auVar154._8_4_ = fVar160;
                  auVar154._12_4_ = fVar160;
                  auVar79 = vfmadd132ps_fma(auVar154,auVar79,local_4a0._0_16_);
                  fVar160 = local_400._0_4_ * 6.0;
                  auVar177._4_4_ = fVar160;
                  auVar177._0_4_ = fVar160;
                  auVar177._8_4_ = fVar160;
                  auVar177._12_4_ = fVar160;
                  auVar79 = vfmadd132ps_fma(auVar177,auVar79,local_460._0_16_);
                  auVar155._0_4_ = auVar79._0_4_ * (float)local_440._0_4_;
                  auVar155._4_4_ = auVar79._4_4_ * (float)local_440._0_4_;
                  auVar155._8_4_ = auVar79._8_4_ * (float)local_440._0_4_;
                  auVar155._12_4_ = auVar79._12_4_ * (float)local_440._0_4_;
                  auVar79 = vdpps_avx(auVar80,auVar79,0x7f);
                  fVar160 = auVar79._0_4_;
                  auVar178._0_4_ = auVar80._0_4_ * fVar160;
                  auVar178._4_4_ = auVar80._4_4_ * fVar160;
                  auVar178._8_4_ = auVar80._8_4_ * fVar160;
                  auVar178._12_4_ = auVar80._12_4_ * fVar160;
                  auVar79 = vsubps_avx(auVar155,auVar178);
                  fVar160 = (float)local_6f0._0_4_ * (float)local_530._0_4_;
                  auVar85 = vmaxss_avx(ZEXT416((uint)fVar135),
                                       ZEXT416((uint)(local_5c0._0_4_ * fVar149 * 1.9073486e-06)));
                  auVar179._0_4_ = auVar79._0_4_ * fVar160;
                  auVar179._4_4_ = auVar79._4_4_ * fVar160;
                  auVar179._8_4_ = auVar79._8_4_ * fVar160;
                  auVar179._12_4_ = auVar79._12_4_ * fVar160;
                  auVar28._8_4_ = 0x80000000;
                  auVar28._0_8_ = 0x8000000080000000;
                  auVar28._12_4_ = 0x80000000;
                  auVar84 = vxorps_avx512vl(auVar80,auVar28);
                  auVar87 = vmulps_avx512vl(auVar76,auVar179);
                  auVar79 = vdpps_avx(auVar84,auVar81,0x7f);
                  auVar76 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar135),auVar85);
                  auVar78 = vdpps_avx(_local_900,auVar87,0x7f);
                  vfmadd213ss_avx512f(auVar77,ZEXT416((uint)(fVar135 / fVar162)),auVar76);
                  fVar160 = auVar79._0_4_ + auVar78._0_4_;
                  auVar78 = vdpps_avx(local_640._0_16_,auVar81,0x7f);
                  auVar79 = vdpps_avx(_local_900,auVar84,0x7f);
                  auVar81 = vmulss_avx512f(auVar86,auVar82);
                  auVar76 = vmulss_avx512f(auVar82,auVar82);
                  auVar82 = vaddss_avx512f(auVar83,ZEXT416((uint)(auVar81._0_4_ * auVar76._0_4_)));
                  auVar81 = vdpps_avx(_local_900,local_640._0_16_,0x7f);
                  auVar77 = vfnmadd231ss_avx512f(auVar79,local_5e0._0_16_,ZEXT416((uint)fVar160));
                  auVar81 = vfnmadd231ss_avx512f(auVar81,local_5e0._0_16_,auVar78);
                  auVar79 = vpermilps_avx(_local_3e0,0xff);
                  fVar159 = fVar159 - auVar79._0_4_;
                  auVar76 = vshufps_avx(auVar80,auVar80,0xff);
                  auVar79 = vfmsub213ss_fma(auVar77,auVar82,auVar76);
                  auVar221._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
                  auVar221._8_4_ = auVar79._8_4_ ^ 0x80000000;
                  auVar221._12_4_ = auVar79._12_4_ ^ 0x80000000;
                  auVar81 = ZEXT416((uint)(auVar81._0_4_ * auVar82._0_4_));
                  auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar79._0_4_)),
                                            ZEXT416((uint)fVar160),auVar81);
                  auVar79 = vinsertps_avx(auVar221,auVar81,0x1c);
                  auVar211._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
                  auVar211._8_4_ = auVar78._8_4_ ^ 0x80000000;
                  auVar211._12_4_ = auVar78._12_4_ ^ 0x80000000;
                  auVar81 = vinsertps_avx(ZEXT416((uint)fVar160),auVar211,0x10);
                  auVar196._0_4_ = auVar82._0_4_;
                  auVar196._4_4_ = auVar196._0_4_;
                  auVar196._8_4_ = auVar196._0_4_;
                  auVar196._12_4_ = auVar196._0_4_;
                  auVar78 = vdivps_avx(auVar79,auVar196);
                  auVar79 = vdivps_avx(auVar81,auVar196);
                  auVar81 = vbroadcastss_avx512vl(local_5e0._0_16_);
                  auVar197._0_4_ = auVar81._0_4_ * auVar78._0_4_ + fVar159 * auVar79._0_4_;
                  auVar197._4_4_ = auVar81._4_4_ * auVar78._4_4_ + fVar159 * auVar79._4_4_;
                  auVar197._8_4_ = auVar81._8_4_ * auVar78._8_4_ + fVar159 * auVar79._8_4_;
                  auVar197._12_4_ = auVar81._12_4_ * auVar78._12_4_ + fVar159 * auVar79._12_4_;
                  auVar78 = vsubps_avx(local_5c0._0_16_,auVar197);
                  auVar206 = ZEXT1664(auVar78);
                  auVar29._8_4_ = 0x7fffffff;
                  auVar29._0_8_ = 0x7fffffff7fffffff;
                  auVar29._12_4_ = 0x7fffffff;
                  auVar79 = vandps_avx512vl(local_5e0._0_16_,auVar29);
                  auVar79 = vucomiss_avx512f(auVar79);
                  auVar224 = ZEXT3264(local_620);
                } while ((bool)uVar73 || (bool)uVar74);
                auVar79 = vaddss_avx512f(auVar85,auVar79);
                auVar79 = vfmadd231ss_fma(auVar79,local_580,ZEXT416(0x36000000));
                auVar30._8_4_ = 0x7fffffff;
                auVar30._0_8_ = 0x7fffffff7fffffff;
                auVar30._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx512vl(ZEXT416((uint)fVar159),auVar30);
              } while (auVar79._0_4_ <= auVar81._0_4_);
              fVar149 = auVar78._0_4_ + (float)local_590._0_4_;
              if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar149) &&
                 (fVar135 = (ray->super_RayK<1>).tfar, fVar149 <= fVar135)) {
                auVar78 = vmovshdup_avx(auVar78);
                fVar159 = auVar78._0_4_;
                if ((0.0 <= fVar159) && (fVar159 <= 1.0)) {
                  auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_600._0_4_));
                  fVar160 = auVar78._0_4_;
                  pGVar7 = (context->scene->geometries).items[local_910].ptr;
                  if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                    fVar160 = fVar160 * 1.5 +
                              (float)local_600._0_4_ * -0.5 * fVar160 * fVar160 * fVar160;
                    auVar198._0_4_ = fVar160 * (float)local_900._0_4_;
                    auVar198._4_4_ = fVar160 * (float)local_900._4_4_;
                    auVar198._8_4_ = fVar160 * fStack_8f8;
                    auVar198._12_4_ = fVar160 * fStack_8f4;
                    auVar76 = vfmadd213ps_fma(auVar76,auVar198,auVar80);
                    auVar78 = vshufps_avx(auVar198,auVar198,0xc9);
                    auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                    auVar199._0_4_ = auVar198._0_4_ * auVar79._0_4_;
                    auVar199._4_4_ = auVar198._4_4_ * auVar79._4_4_;
                    auVar199._8_4_ = auVar198._8_4_ * auVar79._8_4_;
                    auVar199._12_4_ = auVar198._12_4_ * auVar79._12_4_;
                    auVar81 = vfmsub231ps_fma(auVar199,auVar80,auVar78);
                    auVar78 = vshufps_avx(auVar81,auVar81,0xc9);
                    auVar79 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                    auVar142._0_4_ = auVar76._0_4_ * auVar81._0_4_;
                    auVar142._4_4_ = auVar76._4_4_ * auVar81._4_4_;
                    auVar142._8_4_ = auVar76._8_4_ * auVar81._8_4_;
                    auVar142._12_4_ = auVar76._12_4_ * auVar81._12_4_;
                    auVar79 = vfmsub231ps_fma(auVar142,auVar78,auVar79);
                    auVar78 = vshufps_avx(auVar79,auVar79,0xe9);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar149;
                      uVar17 = vmovlps_avx(auVar78);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar17;
                      (ray->Ng).field_0.field_0.z = auVar79._0_4_;
                      ray->u = fVar159;
                      ray->v = 0.0;
                      ray->primID = (uint)local_908;
                      ray->geomID = (uint)local_910;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      local_900._0_4_ = fVar135;
                      local_6e0 = vmovlps_avx(auVar78);
                      local_6d8 = auVar79._0_4_;
                      local_6d4 = fVar159;
                      local_6d0 = 0;
                      local_6cc = (uint)local_908;
                      local_6c8 = (uint)local_910;
                      local_6c4 = context->user->instID[0];
                      local_6c0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = fVar149;
                      local_914 = -1;
                      local_780.valid = &local_914;
                      local_780.geometryUserPtr = pGVar7->userPtr;
                      local_780.context = context->user;
                      local_780.ray = (RTCRayN *)ray;
                      local_780.hit = (RTCHitN *)&local_6e0;
                      local_780.N = 1;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a6ffba:
                        p_Var8 = context->args->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var8)(&local_780);
                          auVar244 = ZEXT3264(local_740);
                          auVar245 = ZEXT3264(local_8e0);
                          auVar243 = ZEXT3264(local_8c0);
                          auVar242 = ZEXT3264(local_8a0);
                          auVar241 = ZEXT3264(local_880);
                          auVar240 = ZEXT3264(local_860);
                          auVar239 = ZEXT3264(local_840);
                          auVar238 = ZEXT3264(local_820);
                          auVar237 = ZEXT3264(local_800);
                          auVar236 = ZEXT3264(local_7e0);
                          auVar246 = ZEXT3264(local_7c0);
                          auVar224 = ZEXT3264(local_620);
                          auVar233 = ZEXT3264(local_6a0);
                          auVar229 = ZEXT3264(local_680);
                          auVar227 = ZEXT3264(local_660);
                          if (*local_780.valid == 0) goto LAB_01a700d6;
                        }
                        (((Vec3f *)((long)local_780.ray + 0x30))->field_0).components[0] =
                             *(float *)local_780.hit;
                        (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_780.hit + 4);
                        (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_780.hit + 8);
                        *(float *)((long)local_780.ray + 0x3c) = *(float *)(local_780.hit + 0xc);
                        *(float *)((long)local_780.ray + 0x40) = *(float *)(local_780.hit + 0x10);
                        *(float *)((long)local_780.ray + 0x44) = *(float *)(local_780.hit + 0x14);
                        *(float *)((long)local_780.ray + 0x48) = *(float *)(local_780.hit + 0x18);
                        *(float *)((long)local_780.ray + 0x4c) = *(float *)(local_780.hit + 0x1c);
                        *(float *)((long)local_780.ray + 0x50) = *(float *)(local_780.hit + 0x20);
                      }
                      else {
                        (*pGVar7->intersectionFilterN)(&local_780);
                        auVar244 = ZEXT3264(local_740);
                        auVar245 = ZEXT3264(local_8e0);
                        auVar243 = ZEXT3264(local_8c0);
                        auVar242 = ZEXT3264(local_8a0);
                        auVar241 = ZEXT3264(local_880);
                        auVar240 = ZEXT3264(local_860);
                        auVar239 = ZEXT3264(local_840);
                        auVar238 = ZEXT3264(local_820);
                        auVar237 = ZEXT3264(local_800);
                        auVar236 = ZEXT3264(local_7e0);
                        auVar246 = ZEXT3264(local_7c0);
                        auVar224 = ZEXT3264(local_620);
                        auVar233 = ZEXT3264(local_6a0);
                        auVar229 = ZEXT3264(local_680);
                        auVar227 = ZEXT3264(local_660);
                        if (*local_780.valid != 0) goto LAB_01a6ffba;
LAB_01a700d6:
                        (ray->super_RayK<1>).tfar = (float)local_900._0_4_;
                      }
                    }
                  }
                }
              }
LAB_01a6fe33:
              fVar135 = (ray->super_RayK<1>).tfar;
              auVar63._4_4_ = fStack_2fc;
              auVar63._0_4_ = local_300;
              auVar63._8_4_ = fStack_2f8;
              auVar63._12_4_ = fStack_2f4;
              auVar63._16_4_ = fStack_2f0;
              auVar63._20_4_ = fStack_2ec;
              auVar63._24_4_ = fStack_2e8;
              auVar63._28_4_ = fStack_2e4;
              fVar149 = (ray->super_RayK<1>).tfar;
              auVar42._4_4_ = fVar149;
              auVar42._0_4_ = fVar149;
              auVar42._8_4_ = fVar149;
              auVar42._12_4_ = fVar149;
              auVar42._16_4_ = fVar149;
              auVar42._20_4_ = fVar149;
              auVar42._24_4_ = fVar149;
              auVar42._28_4_ = fVar149;
              uVar17 = vcmpps_avx512vl(auVar63,auVar42,2);
              bVar69 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar69 & (byte)uVar17;
              auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            }
            uVar20 = vpcmpd_avx512vl(local_2c0,local_220,1);
            uVar19 = vpcmpd_avx512vl(local_2c0,_local_360,1);
            auVar182._0_4_ = (float)local_380._0_4_ + (float)local_2a0._0_4_;
            auVar182._4_4_ = (float)local_380._4_4_ + (float)local_2a0._4_4_;
            auVar182._8_4_ = fStack_378 + fStack_298;
            auVar182._12_4_ = fStack_374 + fStack_294;
            auVar182._16_4_ = fStack_370 + fStack_290;
            auVar182._20_4_ = fStack_36c + fStack_28c;
            auVar182._24_4_ = fStack_368 + fStack_288;
            auVar182._28_4_ = fStack_364 + fStack_284;
            auVar200._4_4_ = fVar135;
            auVar200._0_4_ = fVar135;
            auVar200._8_4_ = fVar135;
            auVar200._12_4_ = fVar135;
            auVar200._16_4_ = fVar135;
            auVar200._20_4_ = fVar135;
            auVar200._24_4_ = fVar135;
            auVar200._28_4_ = fVar135;
            uVar17 = vcmpps_avx512vl(auVar182,auVar200,2);
            bVar69 = (byte)local_744 & (byte)uVar20 & (byte)uVar17;
            auVar183._0_4_ = (float)local_380._0_4_ + (float)local_260._0_4_;
            auVar183._4_4_ = (float)local_380._4_4_ + (float)local_260._4_4_;
            auVar183._8_4_ = fStack_378 + fStack_258;
            auVar183._12_4_ = fStack_374 + fStack_254;
            auVar183._16_4_ = fStack_370 + fStack_250;
            auVar183._20_4_ = fStack_36c + fStack_24c;
            auVar183._24_4_ = fStack_368 + fStack_248;
            auVar183._28_4_ = fStack_364 + fStack_244;
            uVar17 = vcmpps_avx512vl(auVar183,auVar200,2);
            bVar65 = bVar65 & (byte)uVar19 & (byte)uVar17 | bVar69;
            if (bVar65 != 0) {
              abStack_180[uVar68 * 0x60] = bVar65;
              bVar72 = (bool)(bVar69 >> 1 & 1);
              bVar9 = (bool)(bVar69 >> 2 & 1);
              bVar10 = (bool)(bVar69 >> 3 & 1);
              bVar11 = (bool)(bVar69 >> 4 & 1);
              bVar12 = (bool)(bVar69 >> 5 & 1);
              bVar13 = (bool)(bVar69 >> 6 & 1);
              auStack_160[uVar68 * 0x18] =
                   (uint)(bVar69 & 1) * local_2a0._0_4_ |
                   (uint)!(bool)(bVar69 & 1) * local_260._0_4_;
              auStack_160[uVar68 * 0x18 + 1] =
                   (uint)bVar72 * local_2a0._4_4_ | (uint)!bVar72 * local_260._4_4_;
              auStack_160[uVar68 * 0x18 + 2] =
                   (uint)bVar9 * (int)fStack_298 | (uint)!bVar9 * (int)fStack_258;
              auStack_160[uVar68 * 0x18 + 3] =
                   (uint)bVar10 * (int)fStack_294 | (uint)!bVar10 * (int)fStack_254;
              auStack_160[uVar68 * 0x18 + 4] =
                   (uint)bVar11 * (int)fStack_290 | (uint)!bVar11 * (int)fStack_250;
              auStack_160[uVar68 * 0x18 + 5] =
                   (uint)bVar12 * (int)fStack_28c | (uint)!bVar12 * (int)fStack_24c;
              auStack_160[uVar68 * 0x18 + 6] =
                   (uint)bVar13 * (int)fStack_288 | (uint)!bVar13 * (int)fStack_248;
              auStack_160[uVar68 * 0x18 + 7] =
                   (uint)(bVar69 >> 7) * (int)fStack_284 |
                   (uint)!(bool)(bVar69 >> 7) * (int)fStack_244;
              uVar70 = vmovlps_avx(local_2d0);
              (&uStack_140)[uVar68 * 0xc] = uVar70;
              aiStack_138[uVar68 * 0x18] = local_74c + 1;
              uVar68 = (ulong)((int)uVar68 + 1);
            }
            auVar206 = ZEXT3264(local_520);
            prim = local_6b0;
          }
          goto LAB_01a701f6;
        }
      }
      auVar247 = ZEXT3264(auVar93);
      auVar227 = ZEXT3264(local_660);
      auVar229 = ZEXT3264(local_680);
      auVar233 = ZEXT3264(local_6a0);
      auVar224 = ZEXT3264(local_620);
      auVar206 = ZEXT3264(local_520);
      auVar218 = ZEXT3264(local_500);
      auVar246 = ZEXT3264(local_7c0);
      auVar236 = ZEXT3264(local_7e0);
      auVar237 = ZEXT3264(local_800);
      auVar238 = ZEXT3264(local_820);
      auVar239 = ZEXT3264(local_840);
      auVar240 = ZEXT3264(local_860);
      auVar241 = ZEXT3264(local_880);
      auVar242 = ZEXT3264(local_8a0);
      auVar243 = ZEXT3264(local_8c0);
      auVar245 = ZEXT3264(local_8e0);
      auVar244 = ZEXT3264(local_740);
    }
LAB_01a701f6:
    fVar149 = (ray->super_RayK<1>).tfar;
    auVar147._4_4_ = fVar149;
    auVar147._0_4_ = fVar149;
    auVar147._8_4_ = fVar149;
    auVar147._12_4_ = fVar149;
    auVar147._16_4_ = fVar149;
    auVar147._20_4_ = fVar149;
    auVar147._24_4_ = fVar149;
    auVar147._28_4_ = fVar149;
    do {
      uVar75 = (uint)uVar68;
      uVar68 = (ulong)(uVar75 - 1);
      if (uVar75 == 0) {
        uVar17 = vcmpps_avx512vl(auVar147,local_200,0xd);
        local_6a8 = (ulong)((uint)local_6a8 & (uint)uVar17);
        goto LAB_01a6db5d;
      }
      auVar93 = *(undefined1 (*) [32])(auStack_160 + uVar68 * 0x18);
      auVar184._0_4_ = auVar93._0_4_ + (float)local_380._0_4_;
      auVar184._4_4_ = auVar93._4_4_ + (float)local_380._4_4_;
      auVar184._8_4_ = auVar93._8_4_ + fStack_378;
      auVar184._12_4_ = auVar93._12_4_ + fStack_374;
      auVar184._16_4_ = auVar93._16_4_ + fStack_370;
      auVar184._20_4_ = auVar93._20_4_ + fStack_36c;
      auVar184._24_4_ = auVar93._24_4_ + fStack_368;
      auVar184._28_4_ = auVar93._28_4_ + fStack_364;
      uVar17 = vcmpps_avx512vl(auVar184,auVar147,2);
      uVar128 = (uint)uVar17 & (uint)abStack_180[uVar68 * 0x60];
    } while (uVar128 == 0);
    uVar70 = (&uStack_140)[uVar68 * 0xc];
    auVar143._8_8_ = 0;
    auVar143._0_8_ = uVar70;
    auVar185._8_4_ = 0x7f800000;
    auVar185._0_8_ = 0x7f8000007f800000;
    auVar185._12_4_ = 0x7f800000;
    auVar185._16_4_ = 0x7f800000;
    auVar185._20_4_ = 0x7f800000;
    auVar185._24_4_ = 0x7f800000;
    auVar185._28_4_ = 0x7f800000;
    auVar91 = vblendmps_avx512vl(auVar185,auVar93);
    bVar65 = (byte)uVar128;
    auVar127._0_4_ =
         (uint)(bVar65 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar65 & 1) * (int)auVar93._0_4_;
    bVar72 = (bool)((byte)(uVar128 >> 1) & 1);
    auVar127._4_4_ = (uint)bVar72 * auVar91._4_4_ | (uint)!bVar72 * (int)auVar93._4_4_;
    bVar72 = (bool)((byte)(uVar128 >> 2) & 1);
    auVar127._8_4_ = (uint)bVar72 * auVar91._8_4_ | (uint)!bVar72 * (int)auVar93._8_4_;
    bVar72 = (bool)((byte)(uVar128 >> 3) & 1);
    auVar127._12_4_ = (uint)bVar72 * auVar91._12_4_ | (uint)!bVar72 * (int)auVar93._12_4_;
    bVar72 = (bool)((byte)(uVar128 >> 4) & 1);
    auVar127._16_4_ = (uint)bVar72 * auVar91._16_4_ | (uint)!bVar72 * (int)auVar93._16_4_;
    bVar72 = (bool)((byte)(uVar128 >> 5) & 1);
    auVar127._20_4_ = (uint)bVar72 * auVar91._20_4_ | (uint)!bVar72 * (int)auVar93._20_4_;
    bVar72 = (bool)((byte)(uVar128 >> 6) & 1);
    auVar127._24_4_ = (uint)bVar72 * auVar91._24_4_ | (uint)!bVar72 * (int)auVar93._24_4_;
    auVar127._28_4_ =
         (uVar128 >> 7) * auVar91._28_4_ | (uint)!SUB41(uVar128 >> 7,0) * (int)auVar93._28_4_;
    auVar93 = vshufps_avx(auVar127,auVar127,0xb1);
    auVar93 = vminps_avx(auVar127,auVar93);
    auVar91 = vshufpd_avx(auVar93,auVar93,5);
    auVar93 = vminps_avx(auVar93,auVar91);
    auVar91 = vpermpd_avx2(auVar93,0x4e);
    auVar93 = vminps_avx(auVar93,auVar91);
    uVar17 = vcmpps_avx512vl(auVar127,auVar93,0);
    bVar69 = (byte)uVar17 & bVar65;
    if (bVar69 != 0) {
      uVar128 = (uint)bVar69;
    }
    uVar129 = 0;
    for (; (uVar128 & 1) == 0; uVar128 = uVar128 >> 1 | 0x80000000) {
      uVar129 = uVar129 + 1;
    }
    local_74c = aiStack_138[uVar68 * 0x18];
    bVar65 = ~('\x01' << ((byte)uVar129 & 0x1f)) & bVar65;
    abStack_180[uVar68 * 0x60] = bVar65;
    if (bVar65 == 0) {
      uVar75 = uVar75 - 1;
    }
    uVar136 = (undefined4)uVar70;
    auVar158._4_4_ = uVar136;
    auVar158._0_4_ = uVar136;
    auVar158._8_4_ = uVar136;
    auVar158._12_4_ = uVar136;
    auVar158._16_4_ = uVar136;
    auVar158._20_4_ = uVar136;
    auVar158._24_4_ = uVar136;
    auVar158._28_4_ = uVar136;
    auVar78 = vmovshdup_avx(auVar143);
    auVar78 = vsubps_avx(auVar78,auVar143);
    auVar148._0_4_ = auVar78._0_4_;
    auVar148._4_4_ = auVar148._0_4_;
    auVar148._8_4_ = auVar148._0_4_;
    auVar148._12_4_ = auVar148._0_4_;
    auVar148._16_4_ = auVar148._0_4_;
    auVar148._20_4_ = auVar148._0_4_;
    auVar148._24_4_ = auVar148._0_4_;
    auVar148._28_4_ = auVar148._0_4_;
    auVar78 = vfmadd132ps_fma(auVar148,auVar158,_DAT_01f7b040);
    _local_2a0 = ZEXT1632(auVar78);
    local_2d0._8_8_ = 0;
    local_2d0._0_8_ = *(ulong *)(local_2a0 + (ulong)uVar129 * 4);
    uVar68 = (ulong)uVar75;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }